

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

int __thiscall asmjit::v1_14::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  int *piVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  RARegCount RVar6;
  long lVar7;
  char *pcVar8;
  _func_int **pp_Var9;
  BaseNode *pBVar10;
  void *__src;
  BaseBuilder *pBVar11;
  undefined8 uVar12;
  BaseEmitHelper *pBVar13;
  BaseEmitHelper *pBVar14;
  Layout *pLVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined4 workId;
  RegGroup RVar18;
  uint32_t uVar19;
  Error EVar20;
  BaseRAPass *pBVar21;
  WorkToPhysMap *pWVar22;
  BaseRAPass *pBVar23;
  RAStackSlot *pRVar24;
  RABlock *pRVar25;
  byte bVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  BaseRAPass *pBVar30;
  BaseRAPass *pBVar31;
  BaseRAPass *pBVar32;
  BaseRAPass *pBVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long *extraout_RDX;
  RABlock *block;
  BaseRAPass *pBVar38;
  PhysToWorkMap *pPVar39;
  Array<unsigned_char,_4UL> *unaff_RBP;
  BaseRAPass *pBVar40;
  uint *puVar41;
  BaseRAPass *pBVar42;
  BaseRAPass *pBVar43;
  InstNode *node;
  uint uVar44;
  BaseRAPass *pBVar45;
  BaseRAPass *pBVar46;
  Array<unsigned_char,_4UL> *pAVar47;
  BaseRAPass *pBVar48;
  anon_union_4_2_ebeb14a8_for_RARegCount_0 aVar49;
  BaseRAPass *pBVar50;
  BaseRAPass *pBVar51;
  BaseRAPass *unaff_R12;
  ulong uVar52;
  uint uVar53;
  uint uVar54;
  BaseRAPass *unaff_R13;
  BaseRAPass *pBVar55;
  BaseRAPass *pBVar56;
  BaseRAPass *pBVar57;
  int iVar58;
  Array<unsigned_char,_4UL> *pAVar59;
  undefined7 uVar62;
  BaseRAPass *pBVar60;
  InstNode *pIVar61;
  bool bVar63;
  char cVar64;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined8 uStack_588;
  undefined8 uStack_580;
  PhysToWorkMap *pPStack_570;
  BaseRAPass *pBStack_568;
  BaseRAPass *pBStack_560;
  BaseRAPass *pBStack_558;
  InstNode *pIStack_550;
  uint *puStack_548;
  Error EStack_53c;
  ulong uStack_538;
  BaseRAPass *pBStack_530;
  InstNode *pIStack_528;
  BaseRAPass *pBStack_520;
  BaseRAPass *pBStack_518;
  BaseRAPass *pBStack_510;
  BaseRAPass *pBStack_508;
  BaseRAPass *pBStack_500;
  BaseRAPass *pBStack_4f8;
  BaseRAPass *pBStack_4f0;
  BaseRAPass *pBStack_4e8;
  BaseRAPass *pBStack_4e0;
  BaseRAPass *pBStack_4d8;
  BaseRAPass *pBStack_4d0;
  BaseRAPass *pBStack_4c8;
  code *pcStack_4c0;
  code *pcStack_4b8;
  uint uStack_4ac;
  BaseRAPass *pBStack_4a8;
  BaseRAPass *pBStack_4a0;
  BaseRAPass *pBStack_498;
  uint uStack_48c;
  undefined8 uStack_488;
  BaseRAPass *pBStack_480;
  uint uStack_478;
  uint uStack_474;
  BaseRAPass *pBStack_470;
  BaseRAPass *pBStack_468;
  uint uStack_460;
  uint uStack_45c;
  BaseRAPass *pBStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  uint uStack_43c;
  BaseRAPass *pBStack_438;
  ulong uStack_430;
  BaseRAPass *pBStack_428;
  undefined1 auStack_420 [48];
  BaseRAPass *pBStack_3f0;
  undefined1 *puStack_3e8;
  undefined8 auStack_3e0 [32];
  undefined8 auStack_2e0 [33];
  BaseRAPass *pBStack_1d8;
  ulong uStack_1d0;
  ulong uStack_1c8;
  BaseRAPass *pBStack_1c0;
  BaseRAPass *pBStack_1b8;
  ulong uStack_1b0;
  BaseRAPass *pBStack_1a8;
  BaseRAPass *pBStack_1a0;
  BaseRAPass *pBStack_198;
  BaseRAPass *pBStack_190;
  BaseRAPass *pBStack_188;
  BaseRAPass *pBStack_180;
  Array<unsigned_char,_4UL> *pAStack_178;
  uint uStack_164;
  BaseRAPass *pBStack_160;
  BaseRAPass *pBStack_158;
  uint uStack_14c;
  BaseRAPass *pBStack_148;
  uint uStack_13c;
  ulong uStack_138;
  long *plStack_130;
  char cStack_124;
  undefined1 auStack_120 [24];
  BaseRAPass *pBStack_108;
  BaseRAPass *pBStack_100;
  long alStack_f8 [4];
  BaseRAPass *pBStack_d8;
  BaseRAPass *pBStack_d0;
  BaseRAPass *pBStack_c8;
  BaseRAPass *pBStack_c0;
  BaseRAPass *pBStack_b8;
  Array<unsigned_char,_4UL> *pAStack_b0;
  RALocalAllocator *pRStack_a8;
  long lStack_98;
  ulong uStack_90;
  BaseRAPass *pBStack_88;
  BaseRAPass *pBStack_80;
  BaseNode *pBStack_78;
  int iStack_70;
  uint uStack_6c;
  BaseRAPass *pBStack_68;
  BaseRAPass *pBStack_60;
  RALocalAllocator *pRStack_58;
  BaseRAPass *pBStack_50;
  
  pBVar21 = (BaseRAPass *)BaseRAPass::newPhysToWorkMap(this->_pass);
  pBVar32 = this->_pass;
  pWVar22 = BaseRAPass::newWorkToPhysMap(pBVar32);
  pBVar55 = (BaseRAPass *)0x1;
  if (pWVar22 == (WorkToPhysMap *)0x0 || pBVar21 == (BaseRAPass *)0x0) goto LAB_00122950;
  if ((this->_curAssignment)._physToWorkMap == (PhysToWorkMap *)0x0) {
    if ((this->_curAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_00122964;
    pBVar32 = this->_pass;
    bVar26 = (pBVar32->_physRegCount).field_0._regs[0];
    ctx = (EVP_PKEY_CTX *)(ulong)bVar26;
    uVar27 = (uint)(pBVar32->_physRegCount).field_0._regs[1] + (uint)bVar26;
    if (0xff < uVar27) goto LAB_00122969;
    uVar35 = (pBVar32->_physRegCount).field_0._regs[2] + uVar27;
    if (0xff < uVar35) goto LAB_0012296e;
    uVar27 = uVar35 * 0x1000000 | uVar27 * 0x10000 | (uint)bVar26 << 8;
    (this->_curAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar27;
    (this->_curAssignment)._layout.physCount.field_0 = (pBVar32->_physRegCount).field_0;
    uVar35 = (uint)(this->_curAssignment)._layout.physCount.field_0._regs[3] +
             (uint)(this->_curAssignment)._layout.physIndex.super_RARegCount.field_0._regs[3];
    ctx = (EVP_PKEY_CTX *)(ulong)uVar35;
    (this->_curAssignment)._layout.physTotal = uVar35;
    (this->_curAssignment)._layout.workCount = *(uint32_t *)&pBVar32->field_0x148;
    (this->_curAssignment)._layout.workRegs = &pBVar32->_workRegs;
    (this->_curAssignment)._physToWorkMap = (PhysToWorkMap *)pBVar21;
    (this->_curAssignment)._workToPhysMap = pWVar22;
    lVar29 = 0;
    do {
      *(Array<unsigned_char,_4UL> **)((long)(this->_curAssignment)._physToWorkIds._data + lVar29) =
           &(pBVar21->_formatOptions)._indentation +
           ((ulong)(uVar27 >> ((byte)lVar29 & 0x1f) & 0xff) - 0x1b);
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x20);
    pBVar21 = (BaseRAPass *)BaseRAPass::newPhysToWorkMap(pBVar32);
    unaff_R12 = (BaseRAPass *)BaseRAPass::newWorkToPhysMap(this->_pass);
    pBVar32 = this->_pass;
    pWVar22 = BaseRAPass::newWorkToPhysMap(pBVar32);
    this->_tmpWorkToPhysMap = pWVar22;
    if (pWVar22 == (WorkToPhysMap *)0x0 ||
        (unaff_R12 == (BaseRAPass *)0x0 || pBVar21 == (BaseRAPass *)0x0)) {
LAB_00122950:
      return (int)pBVar55;
    }
    if ((this->_tmpAssignment)._physToWorkMap != (PhysToWorkMap *)0x0) goto LAB_00122973;
    if ((this->_tmpAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_00122978;
    pBVar48 = this->_pass;
    bVar26 = (pBVar48->_physRegCount).field_0._regs[0];
    ctx = (EVP_PKEY_CTX *)(ulong)bVar26;
    uVar27 = (uint)(pBVar48->_physRegCount).field_0._regs[1] + (uint)bVar26;
    if (uVar27 < 0x100) {
      uVar35 = (pBVar48->_physRegCount).field_0._regs[2] + uVar27;
      if (uVar35 < 0x100) {
        uVar27 = uVar35 * 0x1000000 | uVar27 * 0x10000 | (uint)bVar26 << 8;
        (this->_tmpAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar27;
        (this->_tmpAssignment)._layout.physCount.field_0 = (pBVar48->_physRegCount).field_0;
        (this->_tmpAssignment)._layout.physTotal =
             (uint)(this->_tmpAssignment)._layout.physCount.field_0._regs[3] +
             (uint)(this->_tmpAssignment)._layout.physIndex.super_RARegCount.field_0._regs[3];
        (this->_tmpAssignment)._layout.workCount = *(uint32_t *)&pBVar48->field_0x148;
        (this->_tmpAssignment)._layout.workRegs = &pBVar48->_workRegs;
        (this->_tmpAssignment)._physToWorkMap = (PhysToWorkMap *)pBVar21;
        (this->_tmpAssignment)._workToPhysMap = (WorkToPhysMap *)unaff_R12;
        pBVar55 = (BaseRAPass *)0x0;
        lVar29 = 0;
        do {
          *(Array<unsigned_char,_4UL> **)
           ((long)(this->_tmpAssignment)._physToWorkIds._data + lVar29) =
               &(pBVar21->_formatOptions)._indentation +
               ((ulong)(uVar27 >> ((byte)lVar29 & 0x1f) & 0xff) - 0x1b);
          lVar29 = lVar29 + 8;
        } while (lVar29 != 0x20);
        goto LAB_00122950;
      }
      goto LAB_00122982;
    }
  }
  else {
    init((EVP_PKEY_CTX *)pBVar32);
LAB_00122964:
    init((EVP_PKEY_CTX *)pBVar32);
LAB_00122969:
    init((EVP_PKEY_CTX *)pBVar32);
LAB_0012296e:
    init((EVP_PKEY_CTX *)pBVar32);
LAB_00122973:
    init((EVP_PKEY_CTX *)pBVar32);
LAB_00122978:
    init((EVP_PKEY_CTX *)pBVar32);
  }
  init((EVP_PKEY_CTX *)pBVar32);
LAB_00122982:
  init((EVP_PKEY_CTX *)pBVar32);
  lVar29 = *(long *)&pBVar32->super_FuncPass;
  pBVar48 = unaff_R12;
  pRStack_58 = this;
  pBStack_50 = unaff_R12;
  if (*(int *)(lVar29 + 0xb8) != 0) {
    pBVar48 = *(BaseRAPass **)(lVar29 + 0x98);
    lVar29 = **(long **)(lVar29 + 0xb0);
    pBStack_60 = (BaseRAPass *)(ulong)*(byte *)&pBVar48->_extraBlock;
    pBStack_68 = (BaseRAPass *)&pBVar32->field_0x48;
    pBStack_78 = (BaseNode *)0x0;
    uVar27 = 1;
    pBVar30 = pBVar32;
    lStack_98 = lVar29;
    pBStack_80 = pBVar32;
    do {
      if (pBStack_60 == (BaseRAPass *)0x0) {
        bVar26 = 0;
      }
      else {
        pBVar43 = (BaseRAPass *)0x0;
        pBVar55 = (BaseRAPass *)0x0;
        do {
          this = (RALocalAllocator *)0x4;
          pBVar21 = pBVar43;
          uVar35 = uVar27;
          do {
            unaff_RBP = (Array<unsigned_char,_4UL> *)(ulong)uVar35;
            if (*(byte *)&pBVar48->_extraBlock <= (byte)pBVar55) {
              pRStack_a8 = (RALocalAllocator *)0x122c89;
              makeInitialAssignment();
LAB_00122c89:
              pRStack_a8 = (RALocalAllocator *)0x122c8e;
              makeInitialAssignment();
LAB_00122c8e:
              pRStack_a8 = (RALocalAllocator *)0x122c93;
              makeInitialAssignment();
LAB_00122c93:
              pRStack_a8 = (RALocalAllocator *)0x122c98;
              makeInitialAssignment();
LAB_00122c98:
              pRStack_a8 = (RALocalAllocator *)0x122c9d;
              makeInitialAssignment();
LAB_00122c9d:
              pRStack_a8 = (RALocalAllocator *)0x122ca2;
              makeInitialAssignment();
LAB_00122ca2:
              pRStack_a8 = (RALocalAllocator *)0x122ca7;
              makeInitialAssignment();
LAB_00122ca7:
              pRStack_a8 = (RALocalAllocator *)0x122cac;
              makeInitialAssignment();
              goto LAB_00122cac;
            }
            iVar28 = 10;
            uVar27 = uVar35;
            if (*(int *)(*(long *)&pBVar48->field_0x348 + (long)pBVar21 * 2) != 0) {
              lVar7 = *(long *)&((Layout *)&pBVar30->super_FuncPass)->physTotal;
              uVar36 = *(int *)(*(long *)&pBVar48->field_0x348 + 4 + (long)pBVar21 * 2) - 0x100;
              if (uVar36 < *(uint *)(lVar7 + 0x1f0)) {
                if (*(uint *)(lVar7 + 0x1f0) <= uVar36) goto LAB_00122c89;
                unaff_R13 = *(BaseRAPass **)
                             (*(long *)(*(long *)(lVar7 + 0x1e8) + (ulong)uVar36 * 8) + 0x28);
                if (unaff_R13 != (BaseRAPass *)0x0) {
                  uVar36 = (((Layout *)&unaff_R13->super_FuncPass)->physIndex).super_RARegCount.
                           field_0._packed;
                  if (*(uint *)(lVar29 + 0x80) <= uVar36) goto LAB_00122c8e;
                  ctx = (EVP_PKEY_CTX *)(ulong)(uVar36 >> 6);
                  if ((*(ulong *)(*(long *)(lVar29 + 0x78) + (long)ctx * 8) >>
                       ((ulong)uVar36 & 0x3f) & 1) != 0) {
                    if (uVar36 == 0xffffffff) goto LAB_00122c93;
                    if (*(uint *)&pBVar30->field_0x54 <= uVar36) goto LAB_00122c98;
                    if (*(char *)(*(long *)&pBVar30->field_0x60 + (ulong)uVar36) != -1)
                    goto LAB_00122aa6;
                    RVar18 = unaff_R13->field_0x21 & kMaxValue;
                    if (kExtraVirt3 < RVar18) goto LAB_00122c9d;
                    ctx = (EVP_PKEY_CTX *)(ulong)RVar18;
                    uVar44 = ~*(uint *)(*(long *)&pBVar30->field_0x68 + (ulong)((uint)RVar18 * 4)) &
                             *(uint *)((long)(&pBVar30->_formatOptions + -10) +
                                      (ulong)((uint)RVar18 * 4) + 8);
                    pBVar32 = (BaseRAPass *)(ulong)uVar44;
                    if ((int)pBStack_78 == 0) {
                      bVar26 = unaff_R13->field_0x4a;
                      uStack_90 = (ulong)bVar26;
                      lVar29 = lStack_98;
                      uVar27 = 2;
                      iVar28 = 0;
                      if ((bVar26 != 0xff) && ((uVar44 >> (bVar26 & 0x1f) & 1) != 0)) {
                        pRStack_a8 = (RALocalAllocator *)0x122bba;
                        pBVar32 = pBStack_68;
                        pBStack_88 = pBVar43;
                        RAAssignment::assign
                                  ((RAAssignment *)pBStack_68,RVar18,uVar36,(uint)bVar26,true);
                        if (pBVar55 < (BaseRAPass *)0x20) {
                          uVar27 = (int)uStack_90 << 0x10 |
                                   (*(uint *)&unaff_R13->field_0x20 & 0xf8) << 0x15;
                          *(uint *)((long)(&pBVar21->_fp + 4) +
                                   *(long *)&pBStack_80->super_FuncPass + 4) =
                               *(byte *)(*(long *)&((Layout *)&unaff_R13->super_FuncPass)->physTotal
                                        + 0xd) + uVar27 + 0x100;
                          iVar28 = 10;
                          goto LAB_00122b5b;
                        }
                        goto LAB_00122ca7;
                      }
                    }
                    else if (uVar44 == 0) {
                      pRStack_a8 = (RALocalAllocator *)0x122c25;
                      pBVar32 = unaff_R13;
                      pBStack_88 = pBVar43;
                      makeInitialAssignment();
                      ctx = (EVP_PKEY_CTX *)pBVar30;
                      pBVar30 = pBStack_80;
                      lVar29 = lStack_98;
                      pBVar43 = pBStack_88;
                      uVar27 = uStack_6c;
                      iVar28 = iStack_70;
                    }
                    else {
                      uVar27 = 0;
                      if (uVar44 != 0) {
                        for (; (uVar44 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uStack_90 = (ulong)uVar27;
                      pRStack_a8 = (RALocalAllocator *)0x122b19;
                      pBVar32 = pBStack_68;
                      pBStack_88 = pBVar43;
                      RAAssignment::assign((RAAssignment *)pBStack_68,RVar18,uVar36,uVar27,true);
                      if ((BaseRAPass *)0x1f < pBVar55) goto LAB_00122ca2;
                      uVar27 = (int)uStack_90 << 0x10 |
                               (*(uint *)&unaff_R13->field_0x20 & 0xf8) << 0x15;
                      *(uint *)((long)(&pBVar21->_fp + 4) + *(long *)&pBStack_80->super_FuncPass + 4
                               ) = *(byte *)(*(long *)&((Layout *)&unaff_R13->super_FuncPass)->
                                                       physTotal + 0xd) + uVar27 + 0x100;
                      iVar28 = 0;
LAB_00122b5b:
                      ctx = (EVP_PKEY_CTX *)(ulong)uVar27;
                      pBVar30 = pBStack_80;
                      lVar29 = lStack_98;
                      pBVar43 = pBStack_88;
                      uVar27 = uVar35;
                    }
                  }
                }
              }
            }
LAB_00122aa6:
            if ((iVar28 != 10) && (iVar28 != 0)) {
              bVar26 = 0;
              goto LAB_00122c3d;
            }
            pBVar21 = (BaseRAPass *)&((Layout *)&pBVar21->super_FuncPass)->physCount;
            this = (RALocalAllocator *)((long)&this[-1]._tmpWorkToPhysMap + 7);
            uVar35 = uVar27;
          } while (this != (RALocalAllocator *)0x0);
          bVar26 = 1;
LAB_00122c3d:
          if (bVar26 == 0) break;
          pBVar55 = (BaseRAPass *)
                    ((long)&(((Layout *)&pBVar55->super_FuncPass)->physIndex).super_RARegCount.
                            field_0 + 1);
          pBVar43 = (BaseRAPass *)&((Layout *)&pBVar43->super_FuncPass)->workRegs;
        } while (pBVar55 != pBStack_60);
        bVar26 = bVar26 ^ 1;
      }
      if ((bVar26 != 0) ||
         (uVar35 = (int)pBStack_78 + 1, pBStack_78 = (BaseNode *)(ulong)uVar35, uVar27 <= uVar35)) {
        return (int)bVar26;
      }
    } while( true );
  }
LAB_00122cac:
  pRStack_a8 = (RALocalAllocator *)0x122cb1;
  makeInitialAssignment();
  pAStack_b0 = (Array<unsigned_char,_4UL> *)0x122cca;
  pRStack_a8 = this;
  memcpy(*(void **)&pBVar32->field_0x68,ctx,(ulong)*(uint *)&pBVar32->field_0x50 * 4 + 0x20);
  pAStack_b0 = (Array<unsigned_char,_4UL> *)0x122cdb;
  memset(*(void **)&pBVar32->field_0x60,0xff,(ulong)*(uint *)&pBVar32->field_0x54);
  lVar29 = 0;
  _cStack_124 = 0xffffffff;
  while (uVar27 = *(uint *)(*(long *)&pBVar32->field_0x68 + lVar29 * 4), uVar27 == 0) {
LAB_00122d1b:
    lVar29 = lVar29 + 1;
    if (lVar29 == 4) {
      return 0;
    }
  }
  bVar26 = *(byte *)((long)(&pBVar32->_formatOptions + -6) + lVar29 + 8);
  pBVar30 = (BaseRAPass *)(ulong)bVar26;
  while( true ) {
    uVar35 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
      }
    }
    pBVar43 = (BaseRAPass *)(ulong)uVar35;
    uVar36 = *(uint *)(*(long *)&pBVar32->field_0x68 + 0x20 + (ulong)(uVar35 + bVar26) * 4);
    if ((ulong)uVar36 == 0xffffffff) break;
    *(char *)(*(long *)&pBVar32->field_0x60 + (ulong)uVar36) = (char)uVar35;
    uVar27 = uVar27 - 1 & uVar27;
    if (uVar27 == 0) goto LAB_00122d1b;
  }
  pAStack_b0 = (Array<unsigned_char,_4UL> *)0x122d2d;
  replaceAssignment();
  alStack_f8[1] = 0;
  alStack_f8[2] = 0;
  pBStack_100 = (BaseRAPass *)0x0;
  alStack_f8[0] = 0;
  auStack_120._16_8_ = (char *)0x0;
  pBStack_108 = (BaseRAPass *)0x0;
  auStack_120._0_8_ = (_func_int **)0x0;
  auStack_120._8_8_ = (BaseBuilder *)0x0;
  alStack_f8[3] = 0;
  lVar29 = *(long *)&pBVar43->super_FuncPass;
  uVar27 = (uint)*(byte *)(lVar29 + 0x10d) + (uint)*(byte *)(lVar29 + 0x10c);
  pBVar50 = (BaseRAPass *)(ulong)uVar27;
  pBVar40 = pBVar32;
  uStack_13c = uVar36;
  pBStack_d8 = pBVar32;
  pBStack_d0 = pBVar48;
  pBStack_c8 = unaff_R13;
  pBStack_c0 = pBVar55;
  pBStack_b8 = pBVar21;
  pAStack_b0 = unaff_RBP;
  if (0xff < uVar27) goto LAB_0012360a;
  uVar35 = *(byte *)(lVar29 + 0x10e) + uVar27;
  if (0xff < uVar35) goto LAB_0012360f;
  pBStack_148 = (BaseRAPass *)&pBVar43->field_0x48;
  auStack_120._16_8_ = lVar29 + 0x140;
  auStack_120._0_4_ = uVar35 * 0x1000000 | uVar27 * 0x10000 | (uint)*(byte *)(lVar29 + 0x10c) << 8;
  auStack_120._4_4_ = *(uint *)(lVar29 + 0x10c);
  auStack_120._12_4_ = *(uint *)(lVar29 + 0x148);
  auStack_120._8_4_ = (*(uint *)(lVar29 + 0x10c) >> 0x18) + ((uint)auStack_120._0_4_ >> 0x18);
  pBVar45 = (BaseRAPass *)pBVar43->_lastTimestamp;
  lVar29 = 0;
  do {
    pAVar47 = &(pBVar30->_formatOptions)._indentation +
              ((ulong)((uint)auStack_120._0_4_ >> ((byte)lVar29 & 0x1f) & 0xff) - 0x1b);
    *(Array<unsigned_char,_4UL> **)((long)alStack_f8 + lVar29) = pAVar47;
    lVar29 = lVar29 + 8;
  } while (lVar29 != 0x20);
  pBVar42 = (BaseRAPass *)0xff;
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x122e57;
  pBStack_160 = pBVar43;
  plStack_130 = extraout_RDX;
  pBStack_108 = pBVar45;
  pBStack_100 = pBVar30;
  memset(pBVar45,0xff,(ulong)(uint)auStack_120._12_4_);
  lVar29 = 0;
LAB_00122e5e:
  aVar49 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)
           ((anon_union_4_2_ebeb14a8_for_RARegCount_0 *)
           (&((Layout *)&pBStack_100->super_FuncPass)->physIndex + lVar29))->_packed;
  if ((anon_union_4_2_ebeb14a8_for_RARegCount_0)aVar49._packed ==
      (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0) goto LAB_00122e9e;
  bVar26 = auStack_120[lVar29];
  pBVar42 = (BaseRAPass *)(ulong)bVar26;
  while( true ) {
    uVar27 = 0;
    if (aVar49._packed != 0) {
      for (; (aVar49._packed >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
      }
    }
    pBVar45 = (BaseRAPass *)(ulong)uVar27;
    pBVar50 = (BaseRAPass *)(ulong)(uVar27 + bVar26);
    pAVar47 = (Array<unsigned_char,_4UL> *)
              (ulong)*(uint *)(&(pBStack_100->_formatOptions)._indentation)
                              [(long)&pBVar50[-1].field_0x495]._data;
    if (pAVar47 == (Array<unsigned_char,_4UL> *)0xffffffff) break;
    (((Layout *)&pBStack_108->super_FuncPass)->physIndex).super_RARegCount.field_0._regs
    [(long)pAVar47] = (uint8_t)uVar27;
    aVar49._packed = aVar49._packed - 1 & aVar49._packed;
    if (aVar49._packed == 0) goto LAB_00122e9e;
  }
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235b5;
  switchToAssignment();
LAB_001235b5:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235ba;
  switchToAssignment();
LAB_001235ba:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235bf;
  switchToAssignment();
  pBVar40 = pBVar55;
LAB_001235bf:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235c4;
  switchToAssignment();
LAB_001235c4:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235c9;
  switchToAssignment();
  pBVar43 = pBVar45;
  pBVar55 = pBVar40;
LAB_001235c9:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235ce;
  switchToAssignment();
  pBVar45 = pBVar43;
  pBVar40 = pBVar48;
LAB_001235ce:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235d3;
  switchToAssignment();
LAB_001235d3:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235d8;
  switchToAssignment();
  pBVar43 = pBVar45;
  pBVar48 = pBVar40;
LAB_001235d8:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235dd;
  switchToAssignment();
LAB_001235dd:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235e2;
  switchToAssignment();
LAB_001235e2:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235e7;
  switchToAssignment();
  pBVar45 = pBVar43;
LAB_001235e7:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235ec;
  switchToAssignment();
LAB_001235ec:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235f1;
  switchToAssignment();
LAB_001235f1:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235f6;
  switchToAssignment();
LAB_001235f6:
  pBVar40 = pBVar32;
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1235fb;
  switchToAssignment();
LAB_001235fb:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x123600;
  switchToAssignment();
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x123605;
  switchToAssignment();
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x12360a;
  switchToAssignment();
  pBVar30 = pBVar42;
  pBVar43 = pBVar45;
LAB_0012360a:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x12360f;
  switchToAssignment();
  pBVar32 = pBVar40;
LAB_0012360f:
  uVar27 = (uint)pBVar30;
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x123614;
  switchToAssignment();
  goto LAB_00123614;
LAB_00122e9e:
  lVar29 = lVar29 + 1;
  if (lVar29 == 4) goto code_r0x00122ea7;
  goto LAB_00122e5e;
code_r0x00122ea7:
  pBVar50 = (BaseRAPass *)0x0;
  pBVar30 = pBStack_160;
LAB_00122eb5:
  pBStack_158 = pBVar50;
  if ((byte)uStack_13c == '\0') {
    uVar27 = *(uint *)(*(long *)&pBVar30->field_0x68 + (long)pBVar50 * 4);
    pBVar55 = (BaseRAPass *)(ulong)uVar27;
    pBVar21 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar21 >> 8),1);
    if (uVar27 == 0) {
      bVar63 = true;
    }
    else {
      do {
        uVar27 = 0;
        uVar35 = (uint)pBVar55;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        pBVar32 = (BaseRAPass *)(ulong)uVar27;
        uVar36 = *(uint *)(*(long *)((long)(&pBVar30->_formatOptions + -2) + (long)pBVar50 * 8) +
                          (long)pBVar32 * 4);
        pBVar48 = (BaseRAPass *)(ulong)uVar36;
        pBVar43 = pBVar45;
        if (pBVar48 == (BaseRAPass *)0xffffffff) goto LAB_001235dd;
        if (*(uint *)(plStack_130 + 1) <= uVar36) goto LAB_001235e2;
        unaff_RBP = (Array<unsigned_char,_4UL> *)((ulong)pAVar47 & 0xffffffff);
        pAVar47 = unaff_RBP;
        if ((*(ulong *)(*plStack_130 + (ulong)(uVar36 >> 6) * 8) >> ((ulong)pBVar48 & 0x3f) & 1) ==
            0) {
          pBVar42 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
          pAStack_178 = (Array<unsigned_char,_4UL> *)0x122fa6;
          pBVar45 = pBStack_148;
          RAAssignment::unassign((RAAssignment *)pBStack_148,(RegGroup)pBVar50,uVar36,uVar27);
          bVar26 = 4;
          pBVar50 = pBStack_158;
          pBVar30 = pBStack_160;
        }
        else {
          if ((uint)auStack_120._12_4_ <= uVar36) goto LAB_001235e7;
          bVar26 = 0;
          if ((((Layout *)&pBStack_108->super_FuncPass)->physIndex).super_RARegCount.field_0._regs
              [(long)pBVar48] != 0xff) goto LAB_00122fbe;
          if ((*(uint *)(*(long *)&pBVar30->field_0x68 + 0x10 + (long)pBVar50 * 4) >>
               (uVar27 & 0x1f) & 1) == 0) {
LAB_00122f5e:
            pBVar42 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
            pAStack_178 = (Array<unsigned_char,_4UL> *)0x122f71;
            pBVar30 = pBStack_148;
            RAAssignment::unassign((RAAssignment *)pBStack_148,(RegGroup)pBVar50,uVar36,uVar27);
            uVar44 = 0;
          }
          else {
            pBVar42 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
            pAStack_178 = (Array<unsigned_char,_4UL> *)0x122f50;
            uVar44 = onSaveReg((RALocalAllocator *)pBVar30,(RegGroup)pBVar50,uVar36,uVar27);
            pBVar50 = pBStack_158;
            if (uVar44 == 0) goto LAB_00122f5e;
          }
          bVar26 = uVar44 != 0;
          pBVar45 = pBVar30;
          pBVar50 = pBStack_158;
          pBVar30 = pBStack_160;
          if ((bool)bVar26) {
            pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uVar44;
          }
        }
LAB_00122fbe:
        if ((bVar26 & 3) != 0) goto LAB_00122fd5;
        uVar35 = uVar35 - 1 & uVar35;
        pBVar55 = (BaseRAPass *)(ulong)uVar35;
      } while (uVar35 != 0);
      bVar26 = 0;
LAB_00122fd5:
      bVar63 = bVar26 == 0;
    }
    if (bVar63) goto LAB_00122fe6;
  }
  else {
LAB_00122fe6:
    pBVar55 = (BaseRAPass *)
              (ulong)(&((Layout *)&pBStack_100->super_FuncPass)->physIndex)[(long)pBVar50].
                     super_RARegCount.field_0._packed;
    pBVar42 = (BaseRAPass *)0xffffffff;
    uVar52 = 0;
    do {
      if ((int)pBVar55 == 0) {
LAB_0012342f:
        uStack_14c = (uint)pBVar50 & 0xff;
        pBVar40 = pBVar30;
        goto LAB_00123437;
      }
      uVar27 = (int)pBVar42 + 1;
      pBVar42 = (BaseRAPass *)(ulong)uVar27;
      if (uVar27 == 2) {
        if ((byte)uStack_13c != '\0') goto LAB_0012342f;
        pAVar47 = (Array<unsigned_char,_4UL> *)0x3;
        break;
      }
      uStack_138 = uVar52;
      pBVar21 = pBVar55;
      do {
        uVar36 = (uint)pBVar42;
        uVar27 = 0;
        uVar35 = (uint)pBVar21;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        pBVar32 = (BaseRAPass *)(ulong)uVar27;
        uVar53 = 1 << ((byte)uVar27 & 0x1f);
        unaff_R13 = (BaseRAPass *)(ulong)uVar53;
        uVar44 = *(uint *)(alStack_f8[(long)pBVar50] + (ulong)(uVar27 * 4));
        unaff_RBP = (Array<unsigned_char,_4UL> *)(ulong)uVar44;
        if (unaff_RBP == (Array<unsigned_char,_4UL> *)0xffffffff) goto LAB_001235b5;
        uVar54 = *(uint *)(*(long *)((long)(&pBVar30->_formatOptions + -2) + (long)pBVar50 * 8) +
                          (ulong)(uVar27 * 4));
        pBVar48 = (BaseRAPass *)(ulong)uVar54;
        pBVar40 = pBVar55;
        if (uVar54 == 0xffffffff) {
LAB_0012324b:
          if (*(uint *)&pBVar30->field_0x54 <= uVar44) goto LAB_001235c4;
          bVar26 = unaff_RBP->_data[*(long *)&pBVar30->field_0x60];
          pBVar55 = (BaseRAPass *)(ulong)bVar26;
          if (bVar26 == 0xff) {
            if (*(uint *)(plStack_130 + 1) <= uVar44) goto LAB_001235d3;
            uVar36 = 0;
            if ((*(ulong *)(*plStack_130 + (ulong)(uVar44 >> 6) * 8) >> ((ulong)unaff_RBP & 0x3f) &
                1) != 0) {
              uVar36 = uVar53;
            }
            uStack_138 = (ulong)((uint)uStack_138 | uVar36);
            cVar64 = '\f';
            pBVar55 = (BaseRAPass *)(ulong)((uint)pBVar40 & ~uVar53);
          }
          else {
            uVar36 = 0;
            if (uVar27 != bVar26) {
              uStack_14c = (uint)pBVar42;
              uStack_164 = (uint)pAVar47;
              pAStack_178 = (Array<unsigned_char,_4UL> *)0x12328f;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_148,(RegGroup)pBVar50,uVar44,uVar27,(uint)bVar26);
              pBVar45 = *(BaseRAPass **)&pBStack_160->super_FuncPass;
              pAStack_178 = (Array<unsigned_char,_4UL> *)0x1232a4;
              uVar36 = (**(code **)(*(long *)&pBVar45->super_FuncPass + 0x48))
                                 (pBVar45,uVar44,uVar27,bVar26);
              pBVar42 = (BaseRAPass *)(ulong)uStack_14c;
              pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uStack_164;
              pBVar50 = pBStack_158;
              pBVar30 = pBStack_160;
            }
            cVar64 = uVar36 != 0;
            pAVar47 = (Array<unsigned_char,_4UL> *)((ulong)pAVar47 & 0xffffffff);
            pBVar55 = pBVar40;
            if ((bool)cVar64) {
              pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uVar36;
            }
          }
          uVar36 = (uint)pBVar42;
          pBVar48 = pBVar40;
          if (cVar64 != '\0') goto LAB_001233f7;
LAB_00123322:
          pBVar45 = pBVar30;
          pBVar48 = (BaseRAPass *)(ulong)uVar36;
          uVar36 = *(uint *)((long)(&pBStack_100->_formatOptions + -10) + (long)pBVar50 * 4);
          pBVar42 = *(BaseRAPass **)&pBVar45->field_0x68;
          uVar54 = *(uint *)((long)(&pBVar42->_formatOptions + -10) + (long)pBVar50 * 4);
          pBVar43 = (BaseRAPass *)(ulong)(uVar54 ^ uVar36);
          pBVar30 = pBVar45;
          if (((uVar54 ^ uVar36) & uVar53) != 0) {
            if ((uVar36 & uVar53) == 0) {
              if ((uVar54 & uVar53) == 0) goto LAB_001235d8;
              uVar54 = uVar36;
              pBVar40 = pBStack_100;
              if (cStack_124 != '\0') {
                pBVar42 = (BaseRAPass *)((ulong)pBVar50 & 0xff);
                unaff_RBP = (Array<unsigned_char,_4UL> *)((ulong)pAVar47 & 0xffffffff);
                pAStack_178 = (Array<unsigned_char,_4UL> *)0x12337e;
                EVar20 = onSaveReg((RALocalAllocator *)pBVar45,(RegGroup)pBVar50,uVar44,uVar27);
                pAVar47 = (Array<unsigned_char,_4UL> *)((ulong)pAVar47 & 0xffffffff);
                cVar64 = '\x01';
                pBVar43 = pBVar45;
                pBVar50 = pBStack_158;
                pBVar30 = pBStack_160;
                if (EVar20 != 0) {
                  pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)EVar20;
                  pBVar42 = pBVar48;
                  goto LAB_001233f7;
                }
                goto LAB_001233b0;
              }
            }
            else {
              pBVar40 = pBVar42;
              if ((uVar54 & uVar53) != 0) goto LAB_001235c9;
            }
            *(uint *)((long)(&pBVar40->_formatOptions + -10) + (long)pBVar50 * 4) = uVar54 | uVar53;
          }
LAB_001233b0:
          pBVar45 = pBVar43;
          pBVar32 = (BaseRAPass *)(ulong)(uVar27 << 2);
          if (*(int *)((long)&(((Layout *)&pBVar32->super_FuncPass)->physIndex).super_RARegCount.
                              field_0 + alStack_f8[(long)pBVar50]) !=
              *(int *)((long)&(((Layout *)&pBVar32->super_FuncPass)->physIndex).super_RARegCount.
                              field_0 +
                      *(long *)((long)(&pBVar30->_formatOptions + -2) + (long)pBVar50 * 8)))
          goto LAB_001235ba;
          pBVar40 = pBVar55;
          if (((*(uint *)((long)(&pBStack_100->_formatOptions + -10) + (long)pBVar50 * 4) & uVar53)
              != 0) != ((*(uint *)(*(long *)&pBVar30->field_0x68 + 0x10 + (long)pBVar50 * 4) &
                        uVar53) != 0)) goto LAB_001235bf;
          unaff_R13 = (BaseRAPass *)(ulong)~uVar53;
          pBVar55 = (BaseRAPass *)(ulong)((uint)pBVar55 & ~uVar53);
          cVar64 = '\0';
          pBVar42 = (BaseRAPass *)0xffffffff;
        }
        else {
          if (uVar54 == uVar44) goto LAB_00123322;
          if ((int)uVar36 < 1) {
            cVar64 = '\f';
          }
          else {
            pBVar40 = pBVar48;
            if (*(uint *)&pBVar30->field_0x54 <= uVar44) goto LAB_001235ce;
            uStack_14c = (uint)pBVar55;
            bVar26 = unaff_RBP->_data[*(long *)&pBVar30->field_0x60];
            if (bVar26 == 0xff) {
              cVar64 = '\f';
            }
            else {
              uStack_164 = (uint)pAVar47;
              RVar18 = (RegGroup)pBVar50;
              if (((byte)*(RAWorkRegs *)
                          ((long)(&pBVar50->_formatOptions + -10) +
                          (long)((Layout *)&pBVar30->super_FuncPass)->workRegs) & 1) == 0) {
                if ((*(uint *)(*(long *)&pBVar30->field_0x68 + 0x10 + (long)pBVar50 * 4) & uVar53)
                    == 0) {
                  pAStack_178 = (Array<unsigned_char,_4UL> *)0x1231bd;
                  pBVar45 = pBStack_148;
                  RAAssignment::unassign((RAAssignment *)pBStack_148,RVar18,uVar54,uVar27);
                  cVar64 = '\x18';
                  pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uStack_164;
                }
                else {
                  uVar37 = ~*(uint *)(*(long *)&pBVar30->field_0x68 + (long)pBVar50 * 4) &
                           *(uint *)(*(long *)&pBVar30->super_FuncPass + 0x118 + (long)pBVar50 * 4);
                  uVar36 = ~(&((Layout *)&pBStack_100->super_FuncPass)->physIndex)[(long)pBVar50].
                            super_RARegCount.field_0._packed & uVar37;
                  if (uVar36 == 0) {
                    uVar36 = uVar37;
                  }
                  if (uVar36 == 0) {
                    if ((*(uint *)(*(long *)&pBVar30->field_0x68 + 0x10 + (long)pBVar50 * 4) &
                        uVar53) == 0) {
LAB_001231f3:
                      pAStack_178 = (Array<unsigned_char,_4UL> *)0x123206;
                      pBVar45 = pBStack_148;
                      RAAssignment::unassign((RAAssignment *)pBStack_148,RVar18,uVar54,uVar27);
                      uVar36 = 0;
                    }
                    else {
                      pAStack_178 = (Array<unsigned_char,_4UL> *)0x1231ef;
                      pBVar45 = pBStack_160;
                      uVar36 = onSaveReg((RALocalAllocator *)pBStack_160,RVar18,uVar54,uVar27);
                      if (uVar36 == 0) goto LAB_001231f3;
                    }
                    uVar54 = uStack_164;
                    if (uVar36 != 0) {
                      uVar54 = uVar36;
                    }
                    pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uVar54;
                    cVar64 = '\x01';
                    if (uVar36 == 0) {
                      cVar64 = '\x18';
                    }
                  }
                  else {
                    uVar19 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    uVar36 = 0;
                    if (uVar19 != uVar27) {
                      pAStack_178 = (Array<unsigned_char,_4UL> *)0x1230f2;
                      RAAssignment::reassign
                                ((RAAssignment *)pBStack_148,(RegGroup)pBStack_158,uVar54,uVar19,
                                 uVar27);
                      pBVar45 = *(BaseRAPass **)&pBStack_160->super_FuncPass;
                      pAStack_178 = (Array<unsigned_char,_4UL> *)0x123108;
                      uVar36 = (**(code **)(*(long *)&pBVar45->super_FuncPass + 0x48))
                                         (pBVar45,pBVar48,uVar19,uVar27);
                    }
                    cVar64 = '\x01';
                    uVar54 = uStack_164;
                    if (uVar36 != 0) {
                      uVar54 = uVar36;
                    }
                    pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uVar54;
                    if (uVar36 == 0) {
                      *(uint *)((long)(&pBStack_160->_formatOptions + -8) + (long)pBStack_158 * 4) =
                           *(uint *)((long)(&pBStack_160->_formatOptions + -8) +
                                    (long)pBStack_158 * 4) | 1 << ((byte)uVar19 & 0x1f);
                      cVar64 = '\x18';
                    }
                  }
                }
                pBVar42 = (BaseRAPass *)0xffffffff;
              }
              else {
                pAStack_178 = (Array<unsigned_char,_4UL> *)0x123172;
                RAAssignment::swap((RAAssignment *)pBStack_148,RVar18,uVar54,uVar27,uVar44,
                                   (uint)bVar26);
                pBVar45 = *(BaseRAPass **)&pBStack_160->super_FuncPass;
                pAStack_178 = (Array<unsigned_char,_4UL> *)0x12318a;
                uVar54 = (**(code **)(*(long *)&pBVar45->super_FuncPass + 0x50))
                                   (pBVar45,pBVar48,uVar27,unaff_RBP,bVar26);
                cVar64 = uVar54 != 0;
                uVar36 = uStack_164;
                if ((bool)cVar64) {
                  uVar36 = uVar54;
                }
                pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uVar36;
                pBVar42 = (BaseRAPass *)0xffffffff;
              }
            }
            uVar36 = (uint)pBVar42;
            pBVar55 = (BaseRAPass *)(ulong)uStack_14c;
            pBVar50 = pBStack_158;
            pBVar30 = pBStack_160;
            if (cVar64 == '\0') goto LAB_00123322;
            pBVar40 = pBVar55;
            if (cVar64 == '\x18') goto LAB_0012324b;
          }
        }
LAB_001233f7:
        if ((cVar64 != '\f') && (cVar64 != '\0')) goto LAB_00123412;
        uVar35 = uVar35 - 1 & uVar35;
        pBVar21 = (BaseRAPass *)(ulong)uVar35;
      } while (uVar35 != 0);
      cVar64 = '\0';
LAB_00123412:
      uVar52 = uStack_138;
    } while (cVar64 == '\0');
    pBVar21 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar21 >> 8),1);
  }
  goto LAB_00123569;
  while( true ) {
    uVar35 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
      }
    }
    unaff_RBP = (Array<unsigned_char,_4UL> *)(ulong)uVar35;
    uVar27 = 1 << ((byte)uVar35 & 0x1f);
    pBVar48 = (BaseRAPass *)(ulong)uVar27;
    if ((*(uint *)(*(long *)&pBVar40->field_0x68 + (long)pBVar50 * 4) >> (uVar35 & 0x1f) & 1) == 0)
    {
      uVar36 = *(uint *)(alStack_f8[(long)pBVar50] + (long)unaff_RBP * 4);
      pBVar55 = (BaseRAPass *)(ulong)uVar36;
      if (*(uint *)(plStack_130 + 1) <= uVar36) goto LAB_001235f1;
      if ((*(ulong *)(*plStack_130 + (ulong)(uVar36 >> 6) * 8) >> ((ulong)pBVar55 & 0x3f) & 1) == 0)
      goto LAB_001235f6;
      uStack_164 = CONCAT31(uStack_164._1_3_,bVar63);
      unaff_R13 = (BaseRAPass *)0x0;
      pAVar59 = (Array<unsigned_char,_4UL> *)((ulong)pAVar47 & 0xffffffff);
      pAStack_178 = (Array<unsigned_char,_4UL> *)0x1234cb;
      uStack_138 = uVar52;
      RAAssignment::assign((RAAssignment *)pBStack_148,(RegGroup)uStack_14c,uVar36,uVar35,false);
      pBVar45 = *(BaseRAPass **)&pBVar40->super_FuncPass;
      pBVar42 = (BaseRAPass *)(ulong)uVar36;
      pAStack_178 = (Array<unsigned_char,_4UL> *)0x1234d9;
      uVar35 = (**(code **)(*(long *)&pBVar45->super_FuncPass + 0x58))(pBVar45,pBVar42,uVar35);
      pAVar47 = pAVar59;
      if (uVar35 != 0) {
        pAVar47 = (Array<unsigned_char,_4UL> *)(ulong)uVar35;
      }
      uVar62 = (undefined7)((ulong)pAVar59 >> 8);
      uVar52 = uStack_138;
      pBVar32 = pBVar40;
      pBVar50 = pBStack_158;
      pBVar30 = pBStack_160;
      if (uVar35 == 0) {
        pBVar21 = (BaseRAPass *)CONCAT71(uVar62,(undefined1)uStack_164);
        if ((*(uint *)((long)(&pBStack_100->_formatOptions + -10) + (long)pBStack_158 * 4) & uVar27)
            != 0) {
          puVar41 = (uint *)(*(long *)&pBStack_160->field_0x68 + 0x10 + (long)pBStack_158 * 4);
          *puVar41 = *puVar41 | uVar27;
        }
        unaff_R13 = (BaseRAPass *)0x1;
        if (((*(uint *)((long)(&pBStack_100->_formatOptions + -10) + (long)pBStack_158 * 4) & uVar27
             ) != 0) !=
            ((*(uint *)(*(long *)&pBStack_160->field_0x68 + 0x10 + (long)pBStack_158 * 4) & uVar27)
            != 0)) goto LAB_001235fb;
      }
      else {
        pBVar21 = (BaseRAPass *)CONCAT71(uVar62,(undefined1)uStack_164);
      }
    }
    else {
      unaff_R13 = (BaseRAPass *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      if ((byte)uStack_13c == '\0') goto LAB_001235ec;
    }
    uVar52 = (ulong)((uint)uVar52 - 1 & (uint)uVar52);
    pBVar40 = pBVar30;
    if ((char)unaff_R13 == '\0') break;
LAB_00123437:
    uVar27 = (uint)uVar52;
    bVar63 = uVar27 != 0;
    pBVar21 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar21 >> 8),bVar63);
    pBVar30 = pBVar40;
    if (uVar27 == 0) break;
  }
LAB_00123569:
  iVar28 = (int)pAVar47;
  if ((byte)pBVar21 != 0) goto LAB_0012357e;
  pBVar50 = (BaseRAPass *)
            ((long)&(((Layout *)&pBVar50->super_FuncPass)->physIndex).super_RARegCount.field_0.
                    _packed + 1);
  if (pBVar50 == (BaseRAPass *)0x4) goto code_r0x0012357b;
  goto LAB_00122eb5;
code_r0x0012357b:
  iVar28 = 0;
LAB_0012357e:
  bVar26 = (byte)pBVar21 | (byte)uStack_13c;
  pBVar21 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar21 >> 8),bVar26);
  if (bVar26 != 0) {
    return iVar28;
  }
  pBVar43 = (BaseRAPass *)auStack_120;
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x123594;
  pBVar30 = pBStack_148;
  bVar63 = RAAssignment::equals((RAAssignment *)pBVar43,(RAAssignment *)pBStack_148);
  uVar27 = (uint)pBVar30;
  if (bVar63) {
    return 0;
  }
LAB_00123614:
  pAStack_178 = (Array<unsigned_char,_4UL> *)0x123619;
  switchToAssignment();
  pAStack_178 = unaff_RBP;
  pBStack_180 = pBVar21;
  pBStack_188 = pBVar55;
  pBStack_190 = unaff_R13;
  pBStack_198 = pBVar48;
  pBStack_1a0 = pBVar32;
  pBStack_1a8 = (BaseRAPass *)&pBVar43->field_0x48;
  pBVar55 = pBVar43;
  while( true ) {
    if (uVar27 == 0) {
      pBVar32 = (BaseRAPass *)0x0;
      goto LAB_001236e8;
    }
    uVar35 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
      }
    }
    uVar36 = 1 << ((byte)uVar35 & 0x1f);
    if ((**(uint **)&pBVar43->field_0x68 >> (uVar35 & 0x1f) & 1) != 0) break;
    bVar63 = true;
LAB_001236d1:
    uVar27 = uVar27 - 1 & uVar27;
    if (!bVar63) {
LAB_001236e8:
      return (int)pBVar32;
    }
  }
  pBVar48 = (BaseRAPass *)(ulong)uVar35;
  RVar6.field_0 =
       (anon_union_4_2_ebeb14a8_for_RARegCount_0)
       ((anon_union_4_2_ebeb14a8_for_RARegCount_0 *)
       (*(long *)&pBVar43->field_0x70 + (long)pBVar48 * 4))->_packed;
  uVar52 = (ulong)(uint)RVar6.field_0;
  uVar44 = *(uint *)(*(long *)&pBVar43->field_0x68 + 0x10);
  if ((uVar44 & uVar36) == 0) {
LAB_001236b0:
    pBVar21 = (BaseRAPass *)0x0;
    uStack_1b0 = 0x1236c3;
    pBVar55 = pBStack_1a8;
    RAAssignment::unassign((RAAssignment *)pBStack_1a8,k0,(uint32_t)RVar6.field_0,uVar35);
LAB_001236c3:
    bVar63 = (int)pBVar21 == 0;
    pBVar32 = (BaseRAPass *)((ulong)pBVar32 & 0xffffffff);
    if (!bVar63) {
      pBVar32 = pBVar21;
    }
    goto LAB_001236d1;
  }
  if (RVar6.field_0._packed == 0xffffffff) {
    uStack_1b0 = 0x1236fe;
    spillScratchGpRegsBeforeEntry();
LAB_001236fe:
    uStack_1b0 = 0x123703;
    spillScratchGpRegsBeforeEntry();
LAB_00123703:
    uStack_1b0 = 0x123708;
    spillScratchGpRegsBeforeEntry();
  }
  else {
    if ((*(anon_union_4_2_ebeb14a8_for_RARegCount_0 *)&pBVar43->field_0x54)._packed <=
        (uint)RVar6.field_0) goto LAB_001236fe;
    bVar26 = *(byte *)(*(long *)&pBVar43->field_0x60 + uVar52);
    pBVar55 = (BaseRAPass *)(ulong)bVar26;
    if (uVar35 != bVar26) goto LAB_00123703;
    pBVar55 = *(BaseRAPass **)&pBVar43->field_0x70;
    if ((anon_union_4_2_ebeb14a8_for_RARegCount_0)
        ((anon_union_4_2_ebeb14a8_for_RARegCount_0 *)
        (&((Layout *)&pBVar55->super_FuncPass)->physIndex + (long)pBVar48))->_packed ==
        RVar6.field_0._packed) {
      *(uint *)(*(long *)&pBVar43->field_0x68 + 0x10) = uVar44 & ~uVar36;
      pBVar55 = *(BaseRAPass **)&pBVar43->super_FuncPass;
      uStack_1b0 = 0x1236a9;
      uVar36 = (**(code **)(*(long *)&pBVar55->super_FuncPass + 0x60))(pBVar55,uVar52,uVar35);
      pBVar21 = (BaseRAPass *)(ulong)uVar36;
      if (uVar36 == 0) goto LAB_001236b0;
      goto LAB_001236c3;
    }
  }
  uStack_1b0 = 0x12370d;
  spillScratchGpRegsBeforeEntry();
  uStack_1b0 = (ulong)uVar35;
  pBStack_1b8 = pBVar21;
  pBStack_1c0 = pBVar43;
  uStack_1c8 = uVar52;
  uStack_1d0 = (ulong)uVar27;
  pBStack_1d8 = pBVar32;
  pBStack_3f0 = pBVar48;
  pBStack_428 = *(BaseRAPass **)&pBVar48->field_0x20;
  *(undefined8 *)(*(long *)&((Layout *)&pBVar55->super_FuncPass)->physTotal + 0x198) =
       *(undefined8 *)&pBVar48->super_FuncPass;
  *(BaseRAPass **)&pBVar55->_instructionCount = pBVar48;
  *(BaseRAPass **)&pBVar55->_sharedAssignments = pBStack_428;
  *(undefined4 *)&pBVar55->field_0xf0 =
       *(undefined4 *)&(pBStack_428->super_FuncPass).super_Pass._name;
  uVar16 = *(undefined3 *)&pBStack_428->field_0x19;
  pBVar55->field_0xf4 = pBStack_428->_allocator;
  *(undefined3 *)&pBVar55->field_0xf5 = uVar16;
  pBStack_470 = (BaseRAPass *)&pBVar55->field_0x48;
  puStack_3e8 = &pBVar48->field_0x40;
  pBVar32 = (BaseRAPass *)0x0;
  uStack_430 = 0;
  pBStack_4a0 = pBVar55;
LAB_0012378e:
  pBVar40 = (BaseRAPass *)0x0;
  bVar26 = (char)pBVar32 * '\b';
  uStack_488 = *(BaseRAPass **)&pBVar55->_sharedAssignments;
  pBVar30 = (BaseRAPass *)0xff;
  uVar27 = *(uint *)((long)&((Layout *)&uStack_488->super_FuncPass)->workRegs + 4) >>
           (bVar26 & 0x1f) & 0xff;
  pBStack_480 = (BaseRAPass *)(ulong)uVar27;
  pBVar45 = (BaseRAPass *)((long)(&uStack_488->_formatOptions + -5) + (ulong)(uVar27 << 5));
  uStack_48c = *(uint *)(&(uStack_488->_formatOptions)._indentation)[(long)&pBVar32[-1].field_0x498]
                        ._data;
  uStack_45c = *(uint *)((long)(&uStack_488->_formatOptions + -7) + (long)pBVar32 * 4 + 8);
  uStack_43c = *(uint *)&pBVar55->field_0xf4 >> (bVar26 & 0x1f) & 0xff;
  pBVar43 = (BaseRAPass *)(ulong)uStack_43c;
  pBVar48 = pBVar45;
  pBStack_4a8 = pBVar32;
  pBStack_498 = pBVar45;
  if (uStack_43c != 0) {
    pBVar46 = (BaseRAPass *)(ulong)uStack_43c;
    pBVar42 = (BaseRAPass *)0x0;
    pBVar33 = (BaseRAPass *)(ulong)uStack_43c;
    uStack_448 = (BaseRAPass *)((ulong)uStack_448._4_4_ << 0x20);
    uVar35 = 0;
    pBVar57 = (BaseRAPass *)0x0;
    do {
      uVar36 = ((Layout *)&pBVar48->super_FuncPass)->physTotal;
      pBVar56 = pBVar57;
      if ((uVar36 & 0x1c00) == 0) {
        pBVar50 = (BaseRAPass *)(ulong)uVar35;
LAB_00123857:
        if ((uVar36 & 0x40008) != 0) {
          pBVar56 = (BaseRAPass *)(ulong)((int)pBVar57 + 1);
          auStack_3e0[(long)pBVar57] = pBVar48;
        }
        if ((uVar36 >> 0x10 & 1) != 0) {
          uVar52 = (ulong)uStack_448 & 0xffffffff;
          pBVar30 = (BaseRAPass *)(ulong)((int)uStack_448 + 1U);
          uStack_448 = (BaseRAPass *)CONCAT44(uStack_448._4_4_,(int)uStack_448 + 1U);
          auStack_2e0[uVar52] = pBVar48;
        }
        iVar28 = (int)pBVar33;
        uVar35 = (uint)pBVar50;
        if ((uVar36 & 4) == 0) {
          ((Layout *)&pBVar48->super_FuncPass)->physTotal = uVar36 | 0x100;
          pBVar33 = (BaseRAPass *)(ulong)(iVar28 - 1);
          pBVar43 = (BaseRAPass *)0x6;
          goto LAB_001239a2;
        }
        pBVar43 = (BaseRAPass *)0x6;
        if ((uVar36 >> 10 & 1) != 0) goto LAB_001239a2;
        uVar44 = (((Layout *)&pBVar48->super_FuncPass)->physIndex).super_RARegCount.field_0._packed;
        pBVar30 = (BaseRAPass *)0xffffffff;
        if ((ulong)uVar44 == 0xffffffff) goto LAB_00124d60;
        if (*(uint *)&pBVar55->field_0x54 <= uVar44) goto LAB_00124d65;
        bVar26 = *(byte *)(*(long *)&pBVar55->field_0x60 + (ulong)uVar44);
        bVar4 = *(undefined1 *)((long)&((Layout *)&pBVar48->super_FuncPass)->workCount + 2);
        pBVar30 = (BaseRAPass *)(ulong)bVar4;
        if (bVar4 == 0xff) {
          pBVar43 = (BaseRAPass *)0x0;
          if (bVar26 != 0xff) {
            uVar53 = 1 << (bVar26 & 0x1f);
            uVar44 = ~uStack_48c & *(uint *)&((Layout *)&pBVar48->super_FuncPass)->workRegs;
            pBVar30 = (BaseRAPass *)(ulong)uVar44;
            if ((uVar44 >> (bVar26 & 0x1f) & 1) == 0) {
              pBVar42 = (BaseRAPass *)(ulong)((uint)pBVar42 | uVar53);
            }
            else {
              *(byte *)((long)&((Layout *)&pBVar48->super_FuncPass)->workCount + 2) = bVar26;
              ((Layout *)&pBVar48->super_FuncPass)->physTotal = uVar36 | 0x100;
              if ((uVar36 & 2) != 0) {
                puVar41 = (uint *)(*(long *)&pBVar55->field_0x68 + 0x10 + (long)pBVar32 * 4);
                *puVar41 = *puVar41 | uVar53;
              }
              pBVar33 = (BaseRAPass *)(ulong)(iVar28 - 1);
              uStack_48c = uStack_48c | uVar53;
            }
            pBVar43 = (BaseRAPass *)0x0;
          }
          goto LAB_001239a2;
        }
        uVar44 = 1 << (bVar4 & 0x1f);
        pBVar43 = (BaseRAPass *)(ulong)uStack_48c;
        pBVar57 = pBVar56;
        if ((uStack_48c >> (bVar4 & 0x1f) & 1) != 0) {
          if (bVar26 == bVar4) {
            ((Layout *)&pBVar48->super_FuncPass)->physTotal = uVar36 | 0x100;
            pBVar30 = (BaseRAPass *)(ulong)(uVar36 | 0x100);
            if ((uVar36 & 2) != 0) {
              puVar41 = (uint *)(*(long *)&pBVar55->field_0x68 + 0x10 + (long)pBVar32 * 4);
              *puVar41 = *puVar41 | 1 << (bVar26 & 0x1f);
              pBVar30 = pBVar32;
            }
            pBVar33 = (BaseRAPass *)(ulong)(iVar28 - 1);
            uStack_48c = uStack_48c | uVar44;
          }
          else {
            pBVar42 = (BaseRAPass *)
                      (ulong)((uint)pBVar42 |
                             uVar44 & *(uint *)(*(long *)&pBVar55->field_0x68 + (long)pBVar32 * 4));
          }
          pBVar43 = (BaseRAPass *)0x0;
          goto LAB_001239a2;
        }
        goto LAB_00124d8d;
      }
      pBVar30 = (BaseRAPass *)(ulong)(uVar36 >> 0xd & 3);
      if ((uVar36 >> 0xc & 1) != 0) {
        pBVar30 = pBVar40;
      }
      uVar44 = 1 << (sbyte)pBVar30;
      if ((uVar35 >> (int)pBVar30 & 1) == 0) {
        *(BaseRAPass **)(auStack_420 + (long)pBVar30 * 8 + 0x10) = pBVar48;
        uVar53 = uVar44 | uVar35;
      }
      else {
        uStack_4ac = 3;
        uVar53 = uVar35;
      }
      pBVar50 = (BaseRAPass *)(ulong)uVar53;
      if ((uVar44 & uVar35) == 0) goto LAB_00123857;
      pBVar43 = (BaseRAPass *)0x1;
      uVar35 = uVar53;
LAB_001239a2:
      if (((int)pBVar43 != 6) && ((int)pBVar43 != 0)) goto LAB_00124d0e;
      pBVar48 = (BaseRAPass *)&pBVar48->field_0x20;
      pBVar46 = (BaseRAPass *)&pBVar46[-1].field_0x4af;
      pBVar57 = pBVar56;
      if (pBVar46 == (BaseRAPass *)0x0) goto LAB_001239ef;
    } while( true );
  }
  uVar35 = 0;
  uStack_448 = (BaseRAPass *)((ulong)uStack_448._4_4_ << 0x20);
  pBVar33 = (BaseRAPass *)0x0;
  pBVar42 = (BaseRAPass *)0x0;
  pBVar46 = uStack_488;
  pBVar57 = (BaseRAPass *)0x0;
LAB_001239ef:
  uVar12 = auStack_420._16_8_;
  pBStack_468 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff00000000);
  uStack_474 = (uint)pBVar57;
  pBVar23 = pBVar42;
  if (uVar35 != 0) {
    pBVar43 = (BaseRAPass *)0x1;
    if ((uVar35 + 1 & uVar35) != 0) {
      uStack_4ac = 3;
      goto LAB_00124d0e;
    }
    uVar36 = 0;
    if (~uVar35 != 0) {
      for (; (~uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
      }
    }
    pBStack_438 = (BaseRAPass *)(ulong)uVar36;
    pBVar46 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar46 >> 8),1);
    pBVar30 = pBStack_438;
    if ((*(byte *)(auStack_420._16_8_ + 9) & 4) == 0) goto LAB_00123c96;
    uVar35 = *(uint *)((long)(&pBVar55->_formatOptions + -10) + (long)pBVar32 * 4 + 8) |
             (uint)pBVar42;
    pBVar46 = (BaseRAPass *)(ulong)uVar35;
    pBVar48 = (BaseRAPass *)(ulong)uVar36;
    if (uVar36 != 0) {
      uVar44 = *(uint *)&pBVar55->field_0x54;
      pBVar30 = (BaseRAPass *)(ulong)uVar44;
      pBVar50 = *(BaseRAPass **)&pBVar55->field_0x60;
      pBVar51 = (BaseRAPass *)0x0;
      while( true ) {
        uVar53 = **(uint **)(auStack_420 + (long)pBVar51 * 8 + 0x10);
        pBVar56 = pBVar57;
        if ((ulong)uVar53 == 0xffffffff) goto LAB_00124d6a;
        pBVar31 = pBVar30;
        pBVar38 = pBVar33;
        if (uVar44 <= uVar53) break;
        *(uint *)(auStack_420 + (long)pBVar51 * 4) =
             (uint)(((Layout *)&pBVar50->super_FuncPass)->physIndex).super_RARegCount.field_0._regs
                   [uVar53];
        pBVar51 = (BaseRAPass *)
                  ((long)&(((Layout *)&pBVar51->super_FuncPass)->physIndex).super_RARegCount.field_0
                  + 1);
        if (pBVar48 == pBVar51) goto LAB_00123aa3;
      }
      goto LAB_00124d6f;
    }
LAB_00123aa3:
    uStack_478 = (uint)pBVar33;
    uVar44 = *(uint *)(uVar12 + 0x10);
    if (uVar44 == 0) {
      pBVar23 = (BaseRAPass *)0xffffffff;
    }
    else {
      uVar35 = uVar35 & ~uStack_48c;
      pBVar46 = (BaseRAPass *)(ulong)uVar35;
      pLVar15 = (Layout *)&pBVar55->super_FuncPass;
      pBVar23 = (BaseRAPass *)0xffffffff;
      pBVar51 = (BaseRAPass *)0x0;
      pBStack_458 = (BaseRAPass *)CONCAT44(pBStack_458._4_4_,uVar44);
      uVar53 = uVar44;
      do {
        pBVar38 = (BaseRAPass *)(ulong)uVar53;
        uVar54 = 0;
        if (uVar53 != 0) {
          for (; (uVar53 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
          }
        }
        pBVar40 = (BaseRAPass *)(ulong)uVar54;
        if ((uVar44 >> (uVar54 & 0x1f) & 1) != 0) {
          if (uVar36 == 0) {
            pBVar56 = (BaseRAPass *)0xf;
          }
          else {
            pBVar31 = (BaseRAPass *)(ulong)uVar54;
            pBVar56 = (BaseRAPass *)0xf;
            pBVar55 = (BaseRAPass *)0x0;
            pBVar60 = (BaseRAPass *)0x1;
            do {
              uVar54 = 1 << ((byte)pBVar31 & 0x1f) & uVar35;
              pBVar30 = (BaseRAPass *)(ulong)uVar54;
              if (uVar54 == 0) {
                pBVar56 = (BaseRAPass *)0x0;
              }
              else {
                if (*(uint *)(*(long *)pLVar15 + 0x148) <=
                    **(uint **)(auStack_420 + (long)pBVar55 * 2 + 0x10)) {
                  pcStack_4b8 = (code *)0x124d47;
                  allocInst();
                  goto LAB_00124d47;
                }
                pBVar43 = (BaseRAPass *)
                          (ulong)(pBVar31 ==
                                 (BaseRAPass *)(ulong)*(uint *)(auStack_420 + (long)pBVar55));
                pBVar56 = (BaseRAPass *)
                          (ulong)((int)pBVar56 +
                                  (uint)(pBVar31 ==
                                        (BaseRAPass *)
                                        (ulong)*(byte *)(*(long *)(*(long *)(*(long *)pLVar15 +
                                                                            0x140) +
                                                                  (ulong)**(uint **)(auStack_420 +
                                                                                    (long)pBVar55 *
                                                                                    2 + 0x10) * 8) +
                                                        0x4a)) +
                                 (uint)(pBVar31 ==
                                       (BaseRAPass *)(ulong)*(uint *)(auStack_420 + (long)pBVar55))
                                 * 2);
              }
              pBVar21 = pBVar60;
              if (uVar54 == 0) break;
              pBVar55 = (BaseRAPass *)&((Layout *)&pBVar55->super_FuncPass)->physCount;
              pBVar31 = (BaseRAPass *)
                        ((long)&(((Layout *)&pBVar31->super_FuncPass)->physIndex).super_RARegCount.
                                field_0._packed + 1);
              pBVar21 = (BaseRAPass *)
                        ((long)&(((Layout *)&pBVar60->super_FuncPass)->physIndex).super_RARegCount.
                                field_0 + 1);
              bVar63 = pBVar60 < pBVar48;
              pBVar60 = pBVar21;
            } while (bVar63);
          }
          pBVar50 = pBVar42;
          pBVar55 = pBStack_4a0;
          if ((uint)pBVar51 < (uint)pBVar56) {
            pBVar23 = pBVar40;
            pBVar51 = pBVar56;
          }
        }
        uVar53 = uVar53 - 1 & uVar53;
        pBVar30 = (BaseRAPass *)(ulong)uVar53;
      } while (uVar53 != 0);
    }
    bVar63 = (int)pBVar23 == -1;
    pBVar46 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar46 >> 8),!bVar63);
    if (bVar63) {
      uStack_4ac = 0x3d;
LAB_00123c96:
      pBVar43 = (BaseRAPass *)0x1;
      pBVar23 = pBVar42;
      if ((char)pBVar46 == '\0') goto LAB_00124d0e;
      goto LAB_00123c9f;
    }
    pBVar40 = (BaseRAPass *)0x0;
    pBVar30 = pBStack_438;
    if (uVar36 == 0) goto LAB_00123c96;
    pBVar48 = (BaseRAPass *)(ulong)(uVar36 * 8);
    pBVar50 = (BaseRAPass *)0x0;
    while( true ) {
      pBVar43 = (BaseRAPass *)0x1;
      uVar35 = 1 << ((byte)pBVar23 & 0x1f);
      puVar41 = *(uint **)((long)(&pBVar50->_formatOptions + -10) + (long)auStack_420);
      pBVar30 = (BaseRAPass *)(ulong)*puVar41;
      if (pBVar30 == (BaseRAPass *)0xffffffff) goto LAB_00124d92;
      if (*(uint *)&pBVar55->field_0x54 <= *puVar41) break;
      bVar26 = (((Layout *)&pBVar30->super_FuncPass)->physIndex).super_RARegCount.field_0._regs
               [*(long *)&pBVar55->field_0x60];
      pBVar30 = (BaseRAPass *)(ulong)bVar26;
      *(byte *)((long)puVar41 + 0xe) = (byte)pBVar23;
      if ((uint)pBVar23 == (uint)bVar26) {
        uVar36 = puVar41[2];
        puVar41[2] = uVar36 | 0x100;
        if ((uVar36 & 2) != 0) {
          pBVar30 = *(BaseRAPass **)&pBVar55->field_0x68;
          puVar41 = (uint *)((long)(&pBVar30->_formatOptions + -10) + (long)pBVar32 * 4);
          *puVar41 = *puVar41 | 1 << (bVar26 & 0x1f);
        }
        pBVar33 = (BaseRAPass *)(ulong)((int)pBVar33 - 1);
      }
      else {
        uVar36 = *(uint *)(*(long *)&pBVar55->field_0x68 + (long)pBVar32 * 4) & uVar35;
        pBVar30 = (BaseRAPass *)(ulong)uVar36;
        pBVar42 = (BaseRAPass *)(ulong)((uint)pBVar42 | uVar36);
      }
      uStack_48c = uStack_48c | uVar35;
      pBVar50 = (BaseRAPass *)&((Layout *)&pBVar50->super_FuncPass)->physTotal;
      pBVar23 = (BaseRAPass *)(ulong)((uint)pBVar23 + 1);
      if (pBVar48 == pBVar50) goto LAB_00123c96;
    }
    goto LAB_00124d97;
  }
  pBStack_438 = (BaseRAPass *)0x0;
LAB_00123c9f:
  pBVar31 = pBVar30;
  pBVar38 = pBVar33;
  pBVar30 = pBVar23;
  if ((uint)pBVar33 != 0) {
    pBVar43 = (BaseRAPass *)0x0;
    pBVar30 = (BaseRAPass *)(ulong)uStack_43c;
    if (uStack_43c == 0) {
LAB_001240f6:
      pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBVar33);
      pBVar31 = pBVar30;
      pBVar38 = pBVar33;
      pBVar30 = pBVar23;
      if ((int)pBVar43 != 0) goto LAB_00124d0e;
      goto LAB_00124102;
    }
    pBVar40 = (BaseRAPass *)
              (ulong)(~(uint)pBVar23 & *(uint *)(*(long *)&pBVar55->field_0x68 + (long)pBVar32 * 4))
    ;
    pBVar46 = (BaseRAPass *)((long)(&uStack_488->_formatOptions + -3) + (ulong)(uVar27 << 5));
    pBVar50 = (BaseRAPass *)(ulong)(uStack_43c << 5);
    pBVar38 = (BaseRAPass *)0x0;
    uStack_478 = (uint)pBVar33;
    pBStack_468 = pBVar46;
    pBStack_458 = pBVar50;
    while( true ) {
      pBVar43 = (BaseRAPass *)0x0;
      pBVar57 = (BaseRAPass *)0x16;
      if ((*(uint *)(&pBVar46[-1].field_0x4a0 + (long)pBVar38) >> 8 & 1) != 0) goto LAB_00124087;
      uVar27 = *(uint *)(&pBVar46[-1].field_0x498 + (long)pBVar38);
      pBVar21 = (BaseRAPass *)(ulong)uVar27;
      pBVar31 = (BaseRAPass *)0xffffffff;
      if (pBVar21 == (BaseRAPass *)0xffffffff) goto LAB_00124d74;
      pBVar42 = pBVar23;
      if (*(uint *)&pBVar55->field_0x54 <= uVar27) goto LAB_00124d79;
      pBVar30 = *(BaseRAPass **)&pBVar55->field_0x60;
      bVar26 = (((Layout *)&pBVar30->super_FuncPass)->physIndex).super_RARegCount.field_0._regs
               [(long)pBVar21];
      uVar35 = (uint)bVar26;
      pBVar42 = pBVar55;
      if ((((uStack_430 & 1) == 0) &&
          ((*(uint *)(&pBVar46[-1].field_0x4a0 + (long)pBVar38) & 0x10) != 0)) && (bVar26 == 0xff))
      break;
LAB_00123d37:
      uVar36 = uStack_48c;
      pBVar57 = (BaseRAPass *)0x0;
      pBVar55 = pBVar42;
      if ((&pBVar46[-1].field_0x4a6)[(long)pBVar38] == -1) {
        pBStack_480 = (BaseRAPass *)CONCAT44(pBStack_480._4_4_,(int)pBVar40);
        uStack_450 = (uint32_t *)(CONCAT44(uStack_450._4_4_,(int)pBVar32) & 0xffffffff000000ff);
        uStack_488 = (BaseRAPass *)CONCAT44(uStack_488._4_4_,uVar35);
        pcStack_4b8 = (code *)0x123d76;
        uVar19 = decideOnAssignment((RALocalAllocator *)pBVar42,(RegGroup)pBVar32,uVar27,
                                    (uint32_t)pBVar30,
                                    ~(uStack_48c | (uint)pBVar23) &
                                    *(uint *)(&pBVar46[-1].field_0x4a8 + (long)pBVar38));
        pBVar48 = (BaseRAPass *)((ulong)uStack_488 & 0xffffffff);
        pBVar30 = (BaseRAPass *)(ulong)uVar19;
        uVar44 = 1 << ((byte)uVar19 & 0x1f);
        uStack_48c = uVar36 | 1 << (uVar19 & 0x1f);
        uVar35 = (uint)pBStack_480;
        pBVar40 = (BaseRAPass *)((ulong)pBStack_480 & 0xffffffff);
        uVar36 = (uint)pBVar23 | uVar44 & (uint)pBStack_480;
        pBVar23 = (BaseRAPass *)(ulong)uVar36;
        (&pBStack_468[-1].field_0x4a6)[(long)pBVar38] = (byte)uVar19;
        if ((uint)uStack_488 == 0xff) {
          if ((uVar44 & (uint)pBStack_480) == 0) {
            pBVar48 = (BaseRAPass *)0x0;
            pcStack_4b8 = (code *)0x124005;
            uStack_460 = uVar44;
            RAAssignment::assign
                      ((RAAssignment *)pBStack_470,(RegGroup)uStack_450,uVar27,uVar19,false);
            pcStack_4b8 = (code *)0x124019;
            uVar27 = (**(code **)(**(long **)&pBStack_4a0->super_FuncPass + 0x58))
                               (*(long **)&pBStack_4a0->super_FuncPass,pBVar21,uVar19);
            if (uVar27 != 0) {
              uStack_4ac = uVar27;
            }
            pBVar30 = (BaseRAPass *)(ulong)uStack_4ac;
            if (uVar27 != 0) {
              pBVar57 = (BaseRAPass *)0x1;
              pBVar32 = pBStack_4a8;
              pBVar46 = pBStack_468;
              pBVar50 = pBStack_458;
              pBVar45 = pBStack_498;
              pBVar55 = pBStack_4a0;
              goto LAB_00124087;
            }
            uVar27 = *(uint *)(&pBStack_468[-1].field_0x4a0 + (long)pBVar38);
            uVar36 = uVar27 | 0x100;
            pBVar30 = (BaseRAPass *)(ulong)uVar36;
            *(uint *)(&pBStack_468[-1].field_0x4a0 + (long)pBVar38) = uVar36;
            if ((uVar27 & 2) != 0) {
              puVar41 = (uint *)(*(long *)&pBStack_4a0->field_0x68 + 0x10 + (long)pBStack_4a8 * 4);
              *puVar41 = *puVar41 | uStack_460;
            }
            uStack_478 = uStack_478 - 1;
            uVar44 = uStack_460;
          }
        }
        else {
          uVar35 = (uint)pBStack_480 & ~(1 << ((uint)uStack_488 & 0x1f));
          pBVar40 = (BaseRAPass *)(ulong)uVar35;
          bVar63 = true;
          if ((uVar44 & uVar35) == 0) {
            uVar53 = 0;
            if (uVar19 != (uint)uStack_488) {
              pcStack_4b8 = (code *)0x123f93;
              uStack_460 = uVar44;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_470,(RegGroup)uStack_450,uVar27,uVar19,
                         (uint)uStack_488);
              pcStack_4b8 = (code *)0x123fab;
              uVar53 = (**(code **)(**(long **)&pBStack_4a0->super_FuncPass + 0x48))
                                 (*(long **)&pBStack_4a0->super_FuncPass,pBVar21,uVar19,
                                  (ulong)uStack_488 & 0xffffffff);
              pBVar48 = (BaseRAPass *)((ulong)uStack_488 & 0xffffffff);
              uVar44 = uStack_460;
            }
            if (uVar53 != 0) {
              uStack_4ac = uVar53;
            }
            pBVar30 = (BaseRAPass *)(ulong)uStack_4ac;
            if (uVar53 == 0) {
              uVar27 = *(uint *)(&pBStack_468[-1].field_0x4a0 + (long)pBVar38);
              uVar53 = uVar27 | 0x100;
              pBVar30 = (BaseRAPass *)(ulong)uVar53;
              *(uint *)(&pBStack_468[-1].field_0x4a0 + (long)pBVar38) = uVar53;
              if ((uVar27 & 2) != 0) {
                puVar41 = (uint *)(*(long *)&pBStack_4a0->field_0x68 + 0x10 + (long)pBStack_4a8 * 4)
                ;
                *puVar41 = *puVar41 | uVar44;
              }
              uStack_478 = uStack_478 - 1;
              bVar63 = true;
            }
            else {
              bVar63 = false;
            }
          }
          pBVar23 = (BaseRAPass *)(ulong)(uVar36 | 1 << ((uint)pBVar48 & 0x1f));
          if (!bVar63) {
            pBVar57 = (BaseRAPass *)0x1;
            pBVar32 = pBStack_4a8;
            pBVar46 = pBStack_468;
            pBVar50 = pBStack_458;
            pBVar45 = pBStack_498;
            pBVar55 = pBStack_4a0;
            goto LAB_00124087;
          }
        }
        pBVar40 = (BaseRAPass *)(ulong)(uVar35 | uVar44);
        pBVar32 = pBStack_4a8;
        pBVar46 = pBStack_468;
        pBVar50 = pBStack_458;
        pBVar45 = pBStack_498;
        pBVar55 = pBStack_4a0;
      }
LAB_00124087:
      if ((((int)pBVar57 != 0x16) && (pBVar43 = pBVar57, (int)pBVar57 != 0)) ||
         (pBVar38 = (BaseRAPass *)&pBVar38->field_0x20, pBVar43 = (BaseRAPass *)0x0,
         pBVar50 == pBVar38)) {
        pBVar33 = (BaseRAPass *)(ulong)uStack_478;
        goto LAB_001240f6;
      }
    }
    uVar36 = *(uint *)((long)&(((Layout *)&pBVar46->super_FuncPass)->physIndex).super_RARegCount.
                              field_0 + (long)pBVar38);
    pBVar55 = (BaseRAPass *)(ulong)uVar36;
    uVar44 = uVar36 ^ uVar36 - 1;
    pBVar30 = (BaseRAPass *)(ulong)uVar44;
    pBVar42 = pBStack_4a0;
    if (uVar44 <= uVar36 - 1) goto LAB_00123d37;
    pBVar42 = *(BaseRAPass **)&pBStack_4a0->super_FuncPass;
    pBStack_480 = pBVar23;
    if (uVar27 < *(uint *)&pBVar42->field_0x148) {
      uStack_450 = *(uint32_t **)(*(long *)&pBVar42->_workRegs + (long)pBVar21 * 8);
      bVar4 = (&pBVar46[-1].field_0x4a5)[(long)pBVar38];
      pBVar48 = (BaseRAPass *)(ulong)bVar4;
      uVar44 = *(uint *)(*(long *)(uStack_450 + 2) + 8);
      pBVar57 = (BaseRAPass *)0x0;
      uVar35 = (uint)bVar26;
      if (bVar4 <= uVar44) {
        uStack_460 = uVar44;
        uVar35 = (uint)bVar26;
        if (*(long *)(uStack_450 + 6) == 0) {
          uStack_430 = CONCAT44(uStack_430._4_4_,(uint)bVar4);
          uStack_488 = (BaseRAPass *)CONCAT44(uStack_488._4_4_,0xff);
          pcStack_4b8 = (code *)0x123e8f;
          pRVar24 = RAStackAllocator::newSlot
                              (&pBVar42->_stackAllocator,
                               (pBVar42->_sp).super_Operand.super_Operand_._baseId,uVar44,
                               (uint)*(byte *)(*(long *)(uStack_450 + 2) + 0xc),1);
          pBVar48 = (BaseRAPass *)(uStack_430 & 0xffffffff);
          uVar35 = (uint)uStack_488;
          *(RAStackSlot **)(uStack_450 + 6) = pRVar24;
          *(byte *)((long)uStack_450 + 0x25) = *(byte *)((long)uStack_450 + 0x25) | 1;
          pBVar46 = pBStack_468;
          pBVar45 = pBStack_498;
        }
        uVar44 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
          }
        }
        piVar2 = (int *)(puStack_3e8 + (ulong)(uVar44 & 0xfffffffc) * 4);
        uVar36 = (pBVar42->_sp).super_Operand.super_Operand_._signature._bits;
        piVar2[1] = uStack_450[1];
        piVar2[2] = 0;
        piVar2[3] = 0;
        *piVar2 = (uVar36 & 0xf8) + (int)pBVar48 * 0x1000000 + 0x2002;
        *(undefined4 *)
         ((long)&(((Layout *)&pBVar46->super_FuncPass)->physIndex).super_RARegCount.field_0 +
         (long)pBVar38) = 0;
        (&pBVar46[-1].field_0x4a1)[(long)pBVar38] = (&pBVar46[-1].field_0x4a1)[(long)pBVar38] | 1;
        pbVar1 = (byte *)((long)&(pBStack_428->super_FuncPass).super_Pass._cb + 7);
        *pbVar1 = *pbVar1 | 0x40;
        uStack_478 = uStack_478 - 1;
        uStack_430 = CONCAT71((int7)((ulong)pBStack_428 >> 8),1);
        pBVar57 = (BaseRAPass *)0x16;
        pBVar32 = pBStack_4a8;
        uVar44 = uStack_460;
      }
      pBVar30 = (BaseRAPass *)(ulong)uVar44;
      pBVar55 = pBStack_4a0;
      pBVar42 = pBStack_4a0;
      pBVar23 = pBStack_480;
      if ((uint)pBVar48 <= uVar44) goto LAB_00124087;
      goto LAB_00123d37;
    }
    goto LAB_00124da1;
  }
LAB_00124102:
  if ((uint)pBVar30 != 0) {
    uStack_488 = (BaseRAPass *)
                 CONCAT44(uStack_488._4_4_,
                          ~(uStack_48c | (uint)pBVar30 |
                           *(uint *)(*(long *)&pBVar55->field_0x68 + (long)pBVar32 * 4) | uStack_45c
                           ) & *(uint *)((long)(&pBVar55->_formatOptions + -10) +
                                        (long)pBVar32 * 4 + 8));
    do {
      pBVar38 = pBVar30;
      uVar27 = 0;
      uVar35 = (uint)pBVar38;
      if (uVar35 != 0) {
        for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      pBVar21 = (BaseRAPass *)(ulong)uVar27;
      pBVar31 = pBVar21;
      if ((*(uint *)(*(long *)&pBVar55->field_0x68 + (long)pBVar32 * 4) >> (uVar27 & 0x1f) & 1) == 0
         ) {
        pBVar43 = (BaseRAPass *)0x0;
        pBVar30 = pBVar38;
      }
      else {
        uVar36 = *(uint *)(*(long *)((long)(&pBVar55->_formatOptions + -2) + (long)pBVar32 * 8) +
                          (long)pBVar21 * 4);
        pBVar30 = (BaseRAPass *)(ulong)uVar36;
        pBVar48 = (BaseRAPass *)((ulong)uStack_488 & 0xffffffff);
        if ((uint)uStack_488 == 0) {
          uStack_488 = (BaseRAPass *)((ulong)uStack_488 & 0xffffffff00000000);
        }
        else {
          pcStack_4b8 = (code *)0x12417a;
          pBVar50 = pBStack_428;
          uVar19 = decideOnReassignment
                             ((RALocalAllocator *)pBVar55,(RegGroup)pBVar32,uVar36,uVar27,
                              (uint)uStack_488,(RAInst *)pBStack_428);
          pBVar43 = (BaseRAPass *)0x0;
          if (uVar19 != 0xff) {
            uVar44 = 0;
            if (uVar19 != uVar27) {
              pBVar48 = (BaseRAPass *)(ulong)uVar27;
              pcStack_4b8 = (code *)0x1241c7;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_470,(RegGroup)pBVar32,uVar36,uVar19,uVar27);
              pBVar55 = *(BaseRAPass **)&pBStack_4a0->super_FuncPass;
              pcStack_4b8 = (code *)0x1241de;
              uVar44 = (**(code **)(*(long *)&pBVar55->super_FuncPass + 0x48))
                                 (pBVar55,pBVar30,uVar19,uVar27);
            }
            pBVar43 = (BaseRAPass *)0x1;
            if (uVar44 != 0) {
              uStack_4ac = uVar44;
            }
            pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
            if (uVar44 == 0) {
              uStack_488 = (BaseRAPass *)
                           CONCAT44(uStack_488._4_4_,(uint)uStack_488 ^ 1 << (uVar19 & 0x1f));
              *(uint *)((long)(&pBStack_4a0->_formatOptions + -8) + (long)pBStack_4a8 * 4) =
                   *(uint *)((long)(&pBStack_4a0->_formatOptions + -8) + (long)pBStack_4a8 * 4) |
                   1 << ((byte)uVar19 & 0x1f);
              pBVar43 = (BaseRAPass *)0x1c;
              pBVar31 = pBStack_4a0;
            }
          }
          pBVar32 = pBStack_4a8;
          pBVar46 = pBVar55;
          pBVar45 = pBStack_498;
          pBVar55 = pBStack_4a0;
          if (uVar19 != 0xff) goto LAB_00124291;
        }
        if ((*(uint *)(*(long *)&pBVar55->field_0x68 + 0x10 + (long)pBVar32 * 4) &
            1 << ((byte)uVar27 & 0x1f)) == 0) {
LAB_0012425f:
          pcStack_4b8 = (code *)0x124272;
          pBVar46 = pBStack_470;
          RAAssignment::unassign((RAAssignment *)pBStack_470,(RegGroup)pBVar32,uVar36,uVar27);
          uVar44 = 0;
        }
        else {
          pcStack_4b8 = (code *)0x124256;
          pBVar46 = pBVar55;
          uVar44 = onSaveReg((RALocalAllocator *)pBVar55,(RegGroup)pBVar32,uVar36,uVar27);
          pBVar32 = pBStack_4a8;
          if (uVar44 == 0) goto LAB_0012425f;
        }
        pBVar43 = (BaseRAPass *)(ulong)(uVar44 != 0);
        if (uVar44 != 0) {
          uStack_4ac = uVar44;
        }
        pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
        pBVar32 = pBStack_4a8;
        pBVar45 = pBStack_498;
      }
LAB_00124291:
      if (((int)pBVar43 != 0x1c) && ((int)pBVar43 != 0)) goto LAB_001242af;
      uVar35 = uVar35 - 1 & uVar35;
      pBVar30 = (BaseRAPass *)(ulong)uVar35;
    } while (uVar35 != 0);
    pBVar43 = (BaseRAPass *)0x0;
LAB_001242af:
    if ((int)pBVar43 != 0) goto LAB_00124d0e;
  }
  if ((int)pBStack_468 != 0) {
    uStack_488 = (BaseRAPass *)(ulong)uStack_43c;
    pBStack_458 = (BaseRAPass *)((ulong)pBStack_458 & 0xffffffff00000000);
    pBVar42 = pBVar50;
    pBVar60 = pBVar21;
    do {
      if (uStack_43c == 0) {
        pBVar21 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
        pBStack_480 = pBVar21;
      }
      else {
        pBVar56 = (BaseRAPass *)0x0;
        pBVar21 = (BaseRAPass *)((ulong)pBStack_468 & 0xffffffff);
        pBStack_480 = pBVar21;
        do {
          pBVar43 = (BaseRAPass *)0x25;
          if ((*(byte *)((long)&pBVar45->super_FuncPass + (long)pBVar56 * 0x20 + 9) & 1) == 0) {
            pBVar40 = (BaseRAPass *)((long)&pBVar45->super_FuncPass + (long)pBVar56 * 0x20);
            uVar27 = (((Layout *)&pBVar40->super_FuncPass)->physIndex).super_RARegCount.field_0.
                     _packed;
            pBVar38 = (BaseRAPass *)(ulong)uVar27;
            if (pBVar38 == (BaseRAPass *)0xffffffff) goto LAB_00124d47;
            if (*(uint *)&pBVar55->field_0x54 <= uVar27) goto LAB_00124d4c;
            bVar26 = (((Layout *)&pBVar38->super_FuncPass)->physIndex).super_RARegCount.field_0.
                     _regs[*(long *)&pBVar55->field_0x60];
            pBVar60 = (BaseRAPass *)(ulong)bVar26;
            bVar4 = *(undefined1 *)((long)&((Layout *)&pBVar40->super_FuncPass)->workCount + 2);
            pBVar30 = (BaseRAPass *)(ulong)bVar4;
            if (bVar4 == bVar26) goto LAB_00124d51;
            pBVar45 = pBVar55;
            pBVar57 = pBVar30;
            if (0x1f < bVar4) goto LAB_00124d56;
            uVar36 = (uint)bVar4;
            uVar35 = *(uint *)(*(long *)((long)(&pBVar55->_formatOptions + -2) + (long)pBVar32 * 8)
                              + (long)pBVar30 * 4);
            pBVar45 = (BaseRAPass *)(ulong)uVar35;
            uVar44 = (uint)bVar4;
            uVar53 = (uint)bVar26;
            if (pBVar45 != (BaseRAPass *)0xffffffff) {
              pBVar21 = *(BaseRAPass **)&pBVar55->super_FuncPass;
              if (*(uint *)&pBVar21->field_0x148 <= uVar35) goto LAB_00124d5b;
              RVar18 = (RegGroup)pBStack_4a8;
              pBVar31 = pBVar30;
              if ((uVar53 == 0xff) ||
                 (pcVar8 = (pBStack_4a0->super_FuncPass).super_Pass._name,
                 bVar5 = (pcVar8 + 0x10)[(long)pBStack_4a8],
                 pBVar31 = (BaseRAPass *)
                           (CONCAT71((int7)((ulong)pcVar8 >> 8),bVar5) & 0xffffffffffffff01),
                 (bVar5 & 1) == 0)) {
                if (((ulong)pBStack_458 & 1) != 0) {
                  uVar36 = ~*(uint *)(*(long *)&pBStack_4a0->field_0x68 + (long)pBStack_4a8 * 4) &
                           *(uint *)((long)(&pBStack_4a0->_formatOptions + -10) +
                                    (long)pBStack_4a8 * 4 + 8);
                  if (uVar36 == 0) {
                    if ((*(uint *)(*(long *)&pBStack_4a0->field_0x68 + 0x10 + (long)pBStack_4a8 * 4)
                         >> (uVar44 & 0x1f) & 1) == 0) {
LAB_0012457b:
                      pcStack_4b8 = (code *)0x12458e;
                      pBVar46 = pBStack_470;
                      RAAssignment::unassign
                                ((RAAssignment *)pBStack_470,(RegGroup)pBStack_4a8,uVar35,uVar44);
                      pBVar21 = (BaseRAPass *)0x0;
                    }
                    else {
                      pcStack_4b8 = (code *)0x124572;
                      pBVar46 = pBStack_4a0;
                      EVar20 = onSaveReg((RALocalAllocator *)pBStack_4a0,RVar18,uVar35,uVar44);
                      pBVar21 = (BaseRAPass *)(ulong)EVar20;
                      if (EVar20 == 0) goto LAB_0012457b;
                    }
                    bVar63 = (int)pBVar21 != 0;
                    pBVar43 = (BaseRAPass *)(ulong)bVar63;
                    pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
                    if (bVar63) {
                      pBVar31 = pBVar21;
                    }
                    uStack_4ac = (uint)pBVar31;
                  }
                  else {
                    uVar35 = ~*(uint *)(&(pBStack_4a0->_formatOptions)._indentation)
                                       [(long)&pBStack_4a8[-1].field_0x49b]._data & uVar36;
                    if (uVar35 == 0) {
                      uVar35 = uVar36;
                    }
                    uVar36 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                      }
                    }
                    pBVar21 = (BaseRAPass *)0x0;
                    if (uVar36 != uVar53) {
                      pBVar48 = (BaseRAPass *)(ulong)uVar53;
                      pcStack_4b8 = (code *)0x124457;
                      RAAssignment::reassign
                                ((RAAssignment *)pBStack_470,RVar18,uVar27,uVar36,uVar53);
                      pBVar46 = *(BaseRAPass **)&pBStack_4a0->super_FuncPass;
                      pcStack_4b8 = (code *)0x12446d;
                      pBVar21 = (BaseRAPass *)
                                (**(code **)(*(long *)&pBVar46->super_FuncPass + 0x48))
                                          (pBVar46,pBVar38,uVar36,bVar26);
                    }
                    pBVar43 = (BaseRAPass *)0x1;
                    bVar63 = (int)pBVar21 != 0;
                    pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
                    if (bVar63) {
                      pBVar31 = (BaseRAPass *)((ulong)pBVar21 & 0xffffffff);
                    }
                    uStack_4ac = (uint)pBVar31;
                    if (!bVar63) {
                      pBVar31 = (BaseRAPass *)(ulong)uVar36;
                      uVar35 = 1 << ((byte)uVar36 & 0x1f);
                      pBVar21 = (BaseRAPass *)(ulong)uVar35;
                      *(uint *)((long)(&pBStack_4a0->_formatOptions + -8) + (long)pBStack_4a8 * 4) =
                           *(uint *)((long)(&pBStack_4a0->_formatOptions + -8) +
                                    (long)pBStack_4a8 * 4) | uVar35;
                      pBVar43 = (BaseRAPass *)0x23;
                    }
                  }
                }
              }
              else {
                uStack_450 = *(uint32_t **)(*(long *)&pBVar21->_workRegs + (long)pBVar45 * 8);
                pBVar42 = (BaseRAPass *)(ulong)uVar36;
                pcStack_4b8 = (code *)0x1243bc;
                RAAssignment::swap((RAAssignment *)pBStack_470,RVar18,uVar27,uVar53,uVar35,uVar36);
                pBVar46 = *(BaseRAPass **)&pBStack_4a0->super_FuncPass;
                pBVar48 = (BaseRAPass *)(ulong)uVar36;
                pcStack_4b8 = (code *)0x1243d5;
                pBVar21 = (BaseRAPass *)
                          (**(code **)(*(long *)&pBVar46->super_FuncPass + 0x50))
                                    (pBVar46,pBVar38,uVar53,pBVar45);
                pBVar43 = (BaseRAPass *)0x1;
                bVar63 = (int)pBVar21 != 0;
                pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
                if (bVar63) {
                  pBVar31 = (BaseRAPass *)((ulong)pBVar21 & 0xffffffff);
                }
                uStack_4ac = (uint)pBVar31;
                if (!bVar63) {
                  uVar35 = ((Layout *)&pBVar40->super_FuncPass)->physTotal;
                  ((Layout *)&pBVar40->super_FuncPass)->physTotal = uVar35 | 0x100;
                  if ((uVar35 & 2) != 0) {
                    puVar41 = (uint *)(*(long *)&pBStack_4a0->field_0x68 + 0x10 +
                                      (long)pBStack_4a8 * 4);
                    *puVar41 = *puVar41 | 1 << (bVar4 & 0x1f);
                  }
                  iVar28 = (int)pBStack_480;
                  pBVar21 = (BaseRAPass *)(ulong)(iVar28 - 1);
                  pBVar31 = pBStack_498;
                  pBVar32 = uStack_488;
                  do {
                    if ((((Layout *)&pBVar31->super_FuncPass)->physIndex).super_RARegCount.field_0.
                        _packed == *uStack_450) goto LAB_00124501;
                    pBVar31 = (BaseRAPass *)&pBVar31->field_0x20;
                    pBVar32 = (BaseRAPass *)&pBVar32[-1].field_0x4af;
                  } while (pBVar32 != (BaseRAPass *)0x0);
                  pBVar31 = (BaseRAPass *)0x0;
LAB_00124501:
                  pBVar43 = (BaseRAPass *)0x25;
                  pBStack_480 = pBVar21;
                  if ((pBVar31 != (BaseRAPass *)0x0) &&
                     (*(undefined1 *)((long)&((Layout *)&pBVar31->super_FuncPass)->workCount + 2) ==
                      bVar26)) {
                    uVar35 = ((Layout *)&pBVar31->super_FuncPass)->physTotal;
                    ((Layout *)&pBVar31->super_FuncPass)->physTotal = uVar35 | 0x100;
                    if ((uVar35 & 2) != 0) {
                      pBVar31 = *(BaseRAPass **)&pBStack_4a0->field_0x68;
                      puVar41 = (uint *)((long)(&pBVar31->_formatOptions + -10) +
                                        (long)pBStack_4a8 * 4);
                      *puVar41 = *puVar41 | 1 << (bVar26 & 0x1f);
                    }
                    pBVar21 = (BaseRAPass *)(ulong)(iVar28 - 2);
                    pBStack_480 = pBVar21;
                  }
                }
              }
              pBVar32 = pBStack_4a8;
              pBVar45 = pBStack_498;
              pBVar55 = pBStack_4a0;
              if ((int)pBVar43 != 0) goto LAB_0012466a;
            }
            if (bVar26 == 0xff) {
              pBVar48 = (BaseRAPass *)0x0;
              pcStack_4b8 = (code *)0x1245fe;
              RAAssignment::assign
                        ((RAAssignment *)pBStack_470,(RegGroup)pBStack_4a8,uVar27,uVar44,false);
              pBVar46 = *(BaseRAPass **)&pBVar55->super_FuncPass;
              pcStack_4b8 = (code *)0x12460d;
              pBVar21 = (BaseRAPass *)
                        (**(code **)(*(long *)&pBVar46->super_FuncPass + 0x58))
                                  (pBVar46,pBVar38,uVar44);
            }
            else {
              pBVar48 = (BaseRAPass *)(ulong)uVar53;
              pcStack_4b8 = (code *)0x1245d8;
              RAAssignment::reassign
                        ((RAAssignment *)pBStack_470,(RegGroup)pBStack_4a8,uVar27,uVar44,uVar53);
              pBVar46 = *(BaseRAPass **)&pBVar55->super_FuncPass;
              pcStack_4b8 = (code *)0x1245ea;
              pBVar21 = (BaseRAPass *)
                        (**(code **)(*(long *)&pBVar46->super_FuncPass + 0x48))
                                  (pBVar46,pBVar38,uVar44,uVar53);
            }
            pBVar43 = (BaseRAPass *)0x1;
            bVar63 = (int)pBVar21 == 0;
            pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
            if (!bVar63) {
              pBVar31 = (BaseRAPass *)((ulong)pBVar21 & 0xffffffff);
            }
            uStack_4ac = (uint)pBVar31;
            pBVar32 = pBStack_4a8;
            pBVar45 = pBStack_498;
            if (bVar63) {
              uVar27 = ((Layout *)&pBVar40->super_FuncPass)->physTotal;
              uVar35 = uVar27 | 0x100;
              pBVar31 = (BaseRAPass *)(ulong)uVar35;
              ((Layout *)&pBVar40->super_FuncPass)->physTotal = uVar35;
              if ((uVar27 & 2) != 0) {
                pBVar31 = *(BaseRAPass **)&pBVar55->field_0x68;
                puVar41 = (uint *)((long)(&pBVar31->_formatOptions + -10) + (long)pBStack_4a8 * 4);
                *puVar41 = *puVar41 | 1 << (bVar4 & 0x1f);
              }
              pBVar21 = (BaseRAPass *)(ulong)((int)pBStack_480 - 1);
              pBVar43 = (BaseRAPass *)0x0;
              pBStack_480 = pBVar21;
            }
          }
LAB_0012466a:
          iVar28 = (int)pBVar43;
          if ((iVar28 != 0) && (iVar28 != 0x25)) {
            if (iVar28 != 0x23) {
              pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBStack_480);
              pBVar50 = pBVar42;
              pBVar21 = pBVar60;
              goto LAB_001246a9;
            }
            break;
          }
          pBVar56 = (BaseRAPass *)
                    ((long)&(((Layout *)&pBVar56->super_FuncPass)->physIndex).super_RARegCount.
                            field_0 + 1);
        } while (pBVar56 != uStack_488);
      }
      pBStack_458 = (BaseRAPass *)
                    CONCAT44(pBStack_458._4_4_,
                             (int)CONCAT71((int7)((ulong)pBVar21 >> 8),
                                           (int)pBStack_468 == (int)pBStack_480));
      pBVar43 = (BaseRAPass *)0x0;
      pBStack_468 = (BaseRAPass *)CONCAT44(pBStack_468._4_4_,(int)pBStack_480);
      pBVar31 = pBStack_480;
      pBVar50 = pBVar42;
      pBVar21 = pBVar60;
LAB_001246a9:
      if ((int)pBVar43 != 0) goto LAB_001246d1;
      pBVar42 = pBVar50;
      pBVar60 = pBVar21;
    } while ((int)pBStack_468 != 0);
    pBVar43 = (BaseRAPass *)0x0;
LAB_001246d1:
    if ((int)pBVar43 != 0) goto LAB_00124d0e;
  }
  if (uStack_474 != 0) {
    pBVar21 = (BaseRAPass *)(ulong)uStack_474;
    pBVar55 = (BaseRAPass *)0x0;
    pBVar40 = (BaseRAPass *)(ulong)uStack_474;
    pBVar57 = (BaseRAPass *)(ulong)uStack_45c;
    while( true ) {
      pBVar42 = (BaseRAPass *)auStack_3e0[(long)pBVar55];
      uVar27 = (((Layout *)&pBVar42->super_FuncPass)->physIndex).super_RARegCount.field_0._packed;
      if ((ulong)uVar27 == 0xffffffff) goto LAB_00124d7e;
      pBVar30 = pBVar31;
      if (*(uint *)&pBStack_4a0->field_0x54 <= uVar27) break;
      bVar26 = *(byte *)(*(long *)&pBStack_4a0->field_0x60 + (ulong)uVar27);
      pBVar38 = (BaseRAPass *)(ulong)bVar26;
      uVar35 = (uint)bVar26;
      if (uVar35 != 0xff) {
        pBVar43 = (BaseRAPass *)((ulong)pBStack_4a8 & 0xff);
        pBVar31 = (BaseRAPass *)(ulong)uVar35;
        pcStack_4b8 = (code *)0x124737;
        pBVar46 = pBStack_470;
        RAAssignment::unassign((RAAssignment *)pBStack_470,(RegGroup)pBStack_4a8,uVar27,uVar35);
        pBVar57 = (BaseRAPass *)(ulong)((uint)pBVar57 & ~(1 << (bVar26 & 0x1f)));
      }
      pBVar40 = (BaseRAPass *)
                (ulong)((int)pBVar40 + -1 +
                       (uint)((((Layout *)&pBVar42->super_FuncPass)->physTotal >> 3 & 1) != 0));
      pBVar55 = (BaseRAPass *)
                ((long)&(((Layout *)&pBVar55->super_FuncPass)->physIndex).super_RARegCount.field_0.
                        _packed + 1);
      if (pBVar21 == pBVar55) goto LAB_00124757;
    }
    goto LAB_00124d83;
  }
  pBVar40 = (BaseRAPass *)0x0;
  pBVar57 = (BaseRAPass *)(ulong)uStack_45c;
  pBVar42 = pBVar30;
LAB_00124757:
  pBVar55 = pBStack_4a0;
  pBVar32 = pBStack_4a8;
  if ((int)pBVar57 != 0) {
    do {
      uVar27 = 0;
      uVar35 = (uint)pBVar57;
      if (uVar35 != 0) {
        for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      uVar36 = *(uint *)(*(long *)((long)(&pBVar55->_formatOptions + -2) + (long)pBVar32 * 8) +
                        (ulong)uVar27 * 4);
      pBVar21 = (BaseRAPass *)(ulong)uVar36;
      if (uVar36 == 0xffffffff) {
        pBVar43 = (BaseRAPass *)0x38;
      }
      else {
        if ((*(uint *)(*(long *)&pBVar55->field_0x68 + 0x10 + (long)pBVar32 * 4) >> (uVar27 & 0x1f)
            & 1) == 0) {
LAB_001247a4:
          pcStack_4b8 = (code *)0x1247b6;
          pBVar46 = pBStack_470;
          RAAssignment::unassign((RAAssignment *)pBStack_470,(RegGroup)pBVar32,uVar36,uVar27);
          uVar44 = 0;
        }
        else {
          pcStack_4b8 = (code *)0x12479b;
          pBVar46 = pBVar55;
          uVar44 = onSaveReg((RALocalAllocator *)pBVar55,(RegGroup)pBVar32,uVar36,uVar27);
          pBVar32 = pBStack_4a8;
          if (uVar44 == 0) goto LAB_001247a4;
        }
        pBVar43 = (BaseRAPass *)(ulong)(uVar44 != 0);
        if (uVar44 != 0) {
          uStack_4ac = uVar44;
        }
        pBVar31 = (BaseRAPass *)(ulong)uStack_4ac;
        pBVar32 = pBStack_4a8;
      }
      if (((int)pBVar43 != 0x38) && ((int)pBVar43 != 0)) goto LAB_001247f2;
      uVar35 = uVar35 - 1 & uVar35;
      pBVar57 = (BaseRAPass *)(ulong)uVar35;
    } while (uVar35 != 0);
    pBVar43 = (BaseRAPass *)0x0;
LAB_001247f2:
    if ((int)pBVar43 != 0) goto LAB_00124d0e;
  }
  if ((int)uStack_448 != 0) {
    uVar34 = (ulong)uStack_448 & 0xffffffff;
    uVar52 = 0;
    do {
      puVar41 = (uint *)auStack_2e0[uVar52];
      pBVar42 = (BaseRAPass *)(ulong)puVar41[4];
      if (puVar41[4] != 0) {
        uVar27 = *puVar41;
        bVar26 = *(byte *)((long)puVar41 + 0xe);
        pBVar21 = (BaseRAPass *)(ulong)bVar26;
        do {
          uVar35 = 0;
          uVar36 = (uint)pBVar42;
          if (uVar36 != 0) {
            for (; (uVar36 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          if (uVar35 != bVar26) {
            pBVar46 = *(BaseRAPass **)&pBStack_4a0->super_FuncPass;
            pBVar43 = (BaseRAPass *)(ulong)uVar27;
            pBVar31 = (BaseRAPass *)(ulong)(uint)bVar26;
            pcStack_4b8 = (code *)0x12483c;
            (**(code **)(*(long *)&pBVar46->super_FuncPass + 0x48))();
          }
          uVar36 = uVar36 - 1 & uVar36;
          pBVar42 = (BaseRAPass *)(ulong)uVar36;
        } while (uVar36 != 0);
      }
      uVar52 = uVar52 + 1;
    } while (uVar52 != uVar34);
  }
  pBVar32 = pBStack_4a8;
  if ((pBStack_4a8 != (BaseRAPass *)0x1) ||
     (pBVar31 = pBStack_3f0, *(char *)&((Layout *)&pBStack_3f0->super_FuncPass)->workRegs != '\x12')
     ) {
LAB_00124959:
    uStack_45c = uStack_45c | uStack_48c;
    pBVar45 = pBStack_4a0;
    if ((int)pBVar40 == 0) {
LAB_00124d03:
      *(uint *)((long)(&pBVar45->_formatOptions + -8) + (long)pBVar32 * 4) =
           *(uint *)((long)(&pBVar45->_formatOptions + -8) + (long)pBVar32 * 4) | uStack_45c;
      pBVar43 = (BaseRAPass *)0x0;
      pBVar55 = pBVar45;
      goto LAB_00124d0e;
    }
    uVar27 = *(uint *)(*(long *)&pBStack_4a0->field_0x68 + (long)pBVar32 * 4);
    pBVar43 = (BaseRAPass *)(ulong)uVar27;
    iVar28 = (int)pBStack_438;
    pBStack_498 = (BaseRAPass *)CONCAT44(pBStack_498._4_4_,uVar27);
    pBVar57 = pBStack_438;
    if (iVar28 != 0) {
      pBVar31 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar31 >> 8),1);
      if ((*(byte *)(auStack_420._16_8_ + 9) & 8) != 0) {
        uVar27 = *(uint *)(auStack_420._16_8_ + 0x14);
        if (uVar27 == 0) {
          pBVar21 = (BaseRAPass *)0xffffffff;
        }
        else {
          uVar35 = *(uint *)((long)(&pBStack_4a0->_formatOptions + -10) + (long)pBVar32 * 4 + 8);
          pBVar43 = (BaseRAPass *)(ulong)uVar35;
          pBVar46 = *(BaseRAPass **)&pBStack_4a0->super_FuncPass;
          pBVar48 = (BaseRAPass *)((ulong)pBStack_438 & 0xffffffff);
          pBVar50 = (BaseRAPass *)0x0;
          pBVar21 = (BaseRAPass *)0xffffffff;
          uVar36 = uVar27;
          do {
            uVar44 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            if ((uVar27 >> (uVar44 & 0x1f) & 1) != 0) {
              uVar53 = (uint)pBVar21;
              uStack_488 = (BaseRAPass *)CONCAT44(uStack_488._4_4_,uVar53);
              pBVar30 = (BaseRAPass *)(ulong)uVar44;
              pBVar38 = (BaseRAPass *)0xf;
              pBVar21 = (BaseRAPass *)(auStack_420 + 0x10);
              pBVar57 = (BaseRAPass *)0x1;
              do {
                uVar54 = 1 << ((byte)pBVar30 & 0x1f) & uVar35;
                pBVar55 = (BaseRAPass *)(ulong)uVar54;
                if (uVar54 == 0) {
                  pBVar38 = (BaseRAPass *)0x0;
                }
                else {
                  pBVar42 = (BaseRAPass *)(ulong)**(uint **)&pBVar21->super_FuncPass;
                  if (*(uint *)&pBVar46->field_0x148 <= **(uint **)&pBVar21->super_FuncPass)
                  goto LAB_00124d88;
                  bVar63 = pBVar30 ==
                           (BaseRAPass *)
                           (ulong)*(byte *)(*(long *)(*(long *)&pBVar46->_workRegs +
                                                     (long)pBVar42 * 8) + 0x4a);
                  pBVar42 = (BaseRAPass *)(ulong)bVar63;
                  pBVar38 = (BaseRAPass *)(ulong)((int)pBVar38 + (uint)bVar63);
                  pBVar32 = pBStack_4a8;
                }
                if (uVar54 == 0) break;
                pBVar21 = (BaseRAPass *)&((Layout *)&pBVar21->super_FuncPass)->physTotal;
                pBVar30 = (BaseRAPass *)
                          ((long)&(((Layout *)&pBVar30->super_FuncPass)->physIndex).super_RARegCount
                                  .field_0._packed + 1);
                bVar63 = pBVar57 < pBVar48;
                pBVar32 = pBStack_4a8;
                pBVar57 = (BaseRAPass *)
                          ((long)&(((Layout *)&pBVar57->super_FuncPass)->physIndex).super_RARegCount
                                  .field_0 + 1);
              } while (bVar63);
              if ((uint)pBVar50 < (uint)pBVar38) {
                uVar53 = uVar44;
                pBVar50 = pBVar38;
              }
              pBVar21 = (BaseRAPass *)(ulong)uVar53;
            }
            uVar36 = uVar36 - 1 & uVar36;
            pBVar31 = (BaseRAPass *)(ulong)uVar36;
          } while (uVar36 != 0);
        }
        iVar58 = (int)pBVar21;
        pBVar31 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar31 >> 8),iVar58 != -1);
        if (iVar58 == -1) {
          uStack_4ac = 0x3d;
          pBVar57 = pBStack_438;
        }
        else {
          pBVar57 = (BaseRAPass *)(ulong)(iVar28 + (uint)(iVar28 == 0));
          pBVar55 = (BaseRAPass *)0x0;
          do {
            uVar27 = iVar58 + (int)pBVar55;
            pBVar46 = (BaseRAPass *)(ulong)uVar27;
            *(char *)(*(long *)(auStack_420 + (long)pBVar55 * 8 + 0x10) + 0xf) = (char)uVar27;
            pBVar55 = (BaseRAPass *)
                      ((long)&(((Layout *)&pBVar55->super_FuncPass)->physIndex).super_RARegCount.
                              field_0._packed + 1);
            pBVar32 = pBStack_4a8;
          } while (pBVar57 != pBVar55);
        }
      }
      pBVar43 = (BaseRAPass *)0x1;
      if ((char)pBVar31 != '\0') goto LAB_00124ade;
LAB_00124cff:
      pBVar55 = pBVar45;
      if ((int)pBVar43 != 0) goto LAB_00124d0e;
      goto LAB_00124d03;
    }
LAB_00124ade:
    pBVar30 = (BaseRAPass *)(ulong)uStack_474;
    if (uStack_474 != 0) {
      pBVar42 = (BaseRAPass *)0x0;
      uStack_488 = (BaseRAPass *)((ulong)uStack_488._4_4_ << 0x20);
      pBVar38 = pBVar30;
      uStack_448 = pBVar30;
      while( true ) {
        pBVar57 = (BaseRAPass *)auStack_3e0[(long)pBVar42];
        uVar27 = ((Layout *)&pBVar57->super_FuncPass)->physTotal;
        pBVar55 = (BaseRAPass *)(ulong)uVar27;
        pBVar43 = (BaseRAPass *)0x4e;
        pBVar45 = pBStack_4a0;
        if ((uVar27 & 8) != 0) break;
LAB_00124cbe:
        if (((int)pBVar43 != 0x4e) && ((int)pBVar43 != 0)) goto LAB_00124cff;
        pBVar42 = (BaseRAPass *)
                  ((long)&(((Layout *)&pBVar42->super_FuncPass)->physIndex).super_RARegCount.field_0
                          ._packed + 1);
        if (pBVar30 == pBVar42) {
          bVar63 = (int)pBVar40 == 0;
          pBVar31 = pBVar30;
          pBVar30 = pBVar38;
          pBVar55 = pBVar45;
          goto LAB_00124ce8;
        }
      }
      uVar35 = (((Layout *)&pBVar57->super_FuncPass)->physIndex).super_RARegCount.field_0._packed;
      pBVar38 = (BaseRAPass *)(ulong)uVar35;
      if (pBVar38 == (BaseRAPass *)0xffffffff) goto LAB_00124da6;
      if (*(uint *)&pBStack_4a0->field_0x54 <= uVar35) goto LAB_00124dab;
      bVar26 = (((Layout *)&pBVar38->super_FuncPass)->physIndex).super_RARegCount.field_0._regs
               [*(long *)&pBStack_4a0->field_0x60];
      pBVar33 = (BaseRAPass *)(ulong)bVar26;
      if (bVar26 != 0xff) {
        pBVar43 = (BaseRAPass *)((ulong)pBVar32 & 0xff);
        pcStack_4b8 = (code *)0x124b57;
        pBVar46 = pBStack_470;
        RAAssignment::unassign((RAAssignment *)pBStack_470,(RegGroup)pBVar32,uVar35,(uint)bVar26);
        pBVar32 = pBStack_4a8;
      }
      pBVar55 = pBStack_4a0;
      bVar26 = *(undefined1 *)((long)&((Layout *)&pBVar57->super_FuncPass)->workCount + 3);
      pBVar21 = (BaseRAPass *)(ulong)bVar26;
      pBVar31 = pBVar21;
      if (bVar26 != 0xff) {
LAB_00124c4e:
        uVar27 = (uint)pBVar31;
        pBVar30 = pBVar33;
        pBVar21 = pBVar31;
        if (0x1f < uVar27) goto LAB_00124db0;
        puVar3 = &pBVar55->field_0x68;
        uVar36 = 1 << ((byte)pBVar31 & 0x1f);
        pBVar55 = (BaseRAPass *)(ulong)uVar36;
        if ((*(uint *)(*(long *)puVar3 + (long)pBVar32 * 4) >> (uVar27 & 0x1f) & 1) == 0) {
          if ((((Layout *)&pBVar57->super_FuncPass)->physTotal & 0x40000) == 0) {
            pBVar48 = (BaseRAPass *)0x1;
            pcStack_4b8 = (code *)0x124c95;
            pBVar46 = pBStack_470;
            RAAssignment::assign((RAAssignment *)pBStack_470,(RegGroup)pBVar32,uVar35,uVar27,true);
            pBVar32 = pBStack_4a8;
          }
          *(byte *)((long)&((Layout *)&pBVar57->super_FuncPass)->workCount + 3) = (byte)pBVar31;
          puVar3 = (undefined1 *)((long)&((Layout *)&pBVar57->super_FuncPass)->physTotal + 1);
          *puVar3 = *puVar3 | 2;
          uStack_488 = (BaseRAPass *)CONCAT44(uStack_488._4_4_,(uint)uStack_488 | uVar36);
          pBStack_498 = (BaseRAPass *)CONCAT44(pBStack_498._4_4_,(uint)pBStack_498 & ~uVar36);
          pBVar40 = (BaseRAPass *)(ulong)((int)pBVar40 - 1);
          pBVar43 = (BaseRAPass *)0x0;
          pBVar30 = uStack_448;
          pBVar45 = pBStack_4a0;
          goto LAB_00124cbe;
        }
        goto LAB_00124db5;
      }
      uVar27 = ~((int)(short)uVar27 >> 0xf & uStack_48c | (uint)uStack_488) &
               *(uint *)((long)&((Layout *)&pBVar57->super_FuncPass)->workRegs + 4);
      uVar52 = (ulong)uVar27;
      uVar36 = ~(uint)pBStack_498 & uVar27;
      pBVar48 = (BaseRAPass *)(ulong)uVar36;
      pBVar46 = pBStack_4a0;
      if (uVar36 != 0) {
        pcStack_4b8 = (code *)0x124baa;
        uVar19 = decideOnAssignment((RALocalAllocator *)pBStack_4a0,(RegGroup)pBVar32,uVar35,uVar27,
                                    uVar36);
        pBVar21 = (BaseRAPass *)(ulong)uVar19;
        pBVar33 = (BaseRAPass *)CONCAT71((int7)(uVar52 >> 8),1);
LAB_00124c40:
        pBVar43 = (BaseRAPass *)0x1;
        pBVar30 = uStack_448;
        pBVar32 = pBStack_4a8;
        pBVar45 = pBVar55;
        pBVar31 = pBVar21;
        if ((char)pBVar33 == '\0') goto LAB_00124cbe;
        goto LAB_00124c4e;
      }
      pBVar31 = (BaseRAPass *)(ulong)(uVar27 & (uint)pBStack_498);
      pBVar43 = (BaseRAPass *)((ulong)pBVar32 & 0xff);
      pBStack_480 = (BaseRAPass *)CONCAT44(pBStack_480._4_4_,(int)pBVar43);
      pBVar48 = (BaseRAPass *)auStack_420;
      pcStack_4b8 = (code *)0x124bd2;
      uVar19 = decideOnSpillFor((RALocalAllocator *)pBStack_4a0,(RegGroup)pBVar32,(uint32_t)pBVar32,
                                uVar27 & (uint)pBStack_498,(uint32_t *)pBVar48);
      workId = auStack_420._0_4_;
      if (uVar19 < 0x20) {
        pBVar21 = (BaseRAPass *)(ulong)uVar19;
        RVar18 = (RegGroup)pBStack_480;
        if ((*(uint *)(*(long *)&pBVar55->field_0x68 + 0x10 + (long)pBStack_4a8 * 4) >>
             (uVar19 & 0x1f) & 1) == 0) {
LAB_00124c1c:
          pcStack_4b8 = (code *)0x124c29;
          pBVar32 = pBVar21;
          pBVar46 = pBStack_470;
          RAAssignment::unassign((RAAssignment *)pBStack_470,RVar18,workId,uVar19);
          uVar27 = 0;
        }
        else {
          pBVar32 = (BaseRAPass *)(ulong)uVar19;
          pcStack_4b8 = (code *)0x124c11;
          pBVar46 = pBStack_4a0;
          uVar27 = onSaveReg((RALocalAllocator *)pBStack_4a0,RVar18,auStack_420._0_4_,uVar19);
          RVar18 = (RegGroup)pBStack_480;
          if (uVar27 == 0) goto LAB_00124c1c;
        }
        pBVar33 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar32 >> 8),uVar27 == 0);
        pBVar55 = pBStack_4a0;
        if (uVar27 != 0) {
          uStack_4ac = uVar27;
        }
        goto LAB_00124c40;
      }
      goto LAB_00124dba;
    }
    bVar63 = false;
    uStack_488 = (BaseRAPass *)((ulong)uStack_488._4_4_ << 0x20);
    pBVar55 = pBStack_4a0;
LAB_00124ce8:
    pBVar40 = (BaseRAPass *)0x0;
    pBVar38 = pBVar30;
    if (bVar63) {
      uStack_45c = uStack_45c | (uint)uStack_488;
      pBVar43 = (BaseRAPass *)0x0;
      pBVar45 = pBVar55;
      goto LAB_00124cff;
    }
    goto LAB_00124dbf;
  }
  uVar27 = *(uint *)(*(long *)&pBStack_4a0->field_0x68 + 4) & *(uint *)&pBStack_3f0->_extraBlock;
  if (uVar27 == 0) {
    pBVar31 = (BaseRAPass *)CONCAT71((int7)((ulong)pBStack_3f0 >> 8),1);
LAB_00124947:
    pBVar43 = (BaseRAPass *)0x1;
    pBVar55 = pBStack_4a0;
    if ((char)pBVar31 == '\0') goto LAB_00124d0e;
    goto LAB_00124959;
  }
  bVar26 = (pBStack_3f0->_formatOptions)._indentation._data[1];
  pBVar55 = (BaseRAPass *)(ulong)bVar26;
  do {
    pBVar57 = (BaseRAPass *)(ulong)uVar27;
    uVar35 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
      }
    }
    pBVar33 = (BaseRAPass *)(ulong)uVar35;
    uVar36 = *(uint *)(*(long *)((long)(&pBStack_4a0->_formatOptions + -2) + (long)pBVar32 * 8) +
                      (long)pBVar33 * 4);
    pBVar21 = (BaseRAPass *)(ulong)uVar36;
    pp_Var9 = (pBStack_4a0->super_FuncPass).super_Pass._vptr_Pass;
    pBVar30 = pBStack_4a0;
    if (*(uint *)(pp_Var9 + 0x29) <= uVar36) goto LAB_00124d9c;
    pBVar31 = (BaseRAPass *)CONCAT71((int7)((ulong)pBStack_4a0 >> 8),1);
    if ((uint)bVar26 < *(uint *)(*(long *)(*(long *)(pp_Var9[0x28] + (long)pBVar21 * 8) + 8) + 8)) {
      if ((*(uint *)(*(long *)&pBStack_4a0->field_0x68 + 0x10 + (long)pBVar32 * 4) >>
           (uVar35 & 0x1f) & 1) == 0) {
LAB_001248f9:
        pBVar43 = (BaseRAPass *)0x1;
        pcStack_4b8 = (code *)0x12490d;
        pBVar46 = pBStack_470;
        RAAssignment::unassign((RAAssignment *)pBStack_470,kVec,uVar36,uVar35);
        uVar44 = 0;
        pBVar32 = pBVar33;
      }
      else {
        pBVar43 = (BaseRAPass *)0x1;
        pBVar32 = (BaseRAPass *)(ulong)uVar35;
        pcStack_4b8 = (code *)0x1248f5;
        pBVar46 = pBStack_4a0;
        uVar44 = onSaveReg((RALocalAllocator *)pBStack_4a0,kVec,uVar36,uVar35);
        if (uVar44 == 0) goto LAB_001248f9;
      }
      pBVar31 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar32 >> 8),uVar44 == 0);
      pBVar32 = pBStack_4a8;
      if (uVar44 != 0) {
        uStack_4ac = uVar44;
      }
    }
    if ((char)pBVar31 == '\0') {
      pBVar31 = (BaseRAPass *)0x0;
      goto LAB_00124947;
    }
    uVar27 = uVar27 - 1 & uVar27;
    if (uVar27 == 0) goto LAB_00124947;
  } while( true );
LAB_00124d0e:
  iVar28 = (int)pBVar43;
  if (iVar28 != 0) goto LAB_00124d24;
  pBVar32 = (BaseRAPass *)
            ((long)&(((Layout *)&pBVar32->super_FuncPass)->physIndex).super_RARegCount.field_0.
                    _packed + 1);
  if (pBVar32 == (BaseRAPass *)0x4) {
    iVar28 = 2;
LAB_00124d24:
    if (iVar28 == 2) {
      uStack_4ac = 0;
    }
    return uStack_4ac;
  }
  goto LAB_0012378e;
  while( true ) {
    puVar41 = puVar41 + 8;
    uVar34 = uVar34 - 1;
    if (uVar34 == 0) break;
LAB_00124e97:
    if (*puVar41 == extraout_EDX_00) goto LAB_00124eab;
  }
LAB_00124ea9:
  puVar41 = (uint *)0x0;
LAB_00124eab:
  if ((puVar41 == (uint *)0x0) || ((puVar41[2] & 0x40008) == 0)) {
    if ((*(byte *)(lVar29 + 0x24) & 4) == 0) {
      uVar35 = ~*(uint *)(lVar29 + 0x38) & uVar35;
      if (uVar35 != 0) {
        uVar27 = ~*(uint *)(&(pBVar46->_formatOptions)._indentation)[uVar52 - 0x15]._data & uVar35;
        if (uVar27 == 0) {
          uVar27 = uVar35;
        }
        iVar28 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
          }
        }
      }
      if (uVar35 != 0) {
        return iVar28;
      }
    }
    iVar28 = 0xff;
  }
  else {
    iVar28 = 0;
    if (uVar35 != 0) {
      for (; (uVar35 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
      }
    }
  }
  return iVar28;
LAB_00124d47:
  pcStack_4b8 = (code *)0x124d4c;
  allocInst();
LAB_00124d4c:
  pcStack_4b8 = (code *)0x124d51;
  allocInst();
LAB_00124d51:
  pcStack_4b8 = (code *)0x124d56;
  allocInst();
  pBVar45 = pBVar55;
  pBVar57 = pBVar30;
LAB_00124d56:
  pBVar30 = pBVar31;
  pcStack_4b8 = (code *)0x124d5b;
  allocInst();
LAB_00124d5b:
  pcStack_4b8 = (code *)0x124d60;
  allocInst();
  pBVar33 = pBVar38;
  pBVar50 = pBVar42;
  pBVar55 = pBVar45;
  pBVar42 = pBVar57;
  pBVar21 = pBVar60;
LAB_00124d60:
  pcStack_4b8 = (code *)0x124d65;
  allocInst();
LAB_00124d65:
  pcStack_4b8 = (code *)0x124d6a;
  allocInst();
LAB_00124d6a:
  pcStack_4b8 = (code *)0x124d6f;
  allocInst();
  pBVar31 = pBVar30;
  pBVar38 = pBVar33;
  pBVar23 = pBVar42;
  pBVar57 = pBVar56;
LAB_00124d6f:
  pcStack_4b8 = (code *)0x124d74;
  allocInst();
LAB_00124d74:
  pcStack_4b8 = (code *)0x124d79;
  allocInst();
  pBVar42 = pBVar23;
LAB_00124d79:
  pcStack_4b8 = (code *)0x124d7e;
  allocInst();
LAB_00124d7e:
  pcStack_4b8 = (code *)0x124d83;
  allocInst();
  pBVar30 = pBVar31;
LAB_00124d83:
  pcStack_4b8 = (code *)0x124d88;
  allocInst();
LAB_00124d88:
  pcStack_4b8 = (code *)0x124d8d;
  allocInst();
  pBVar33 = pBVar38;
LAB_00124d8d:
  pcStack_4b8 = (code *)0x124d92;
  allocInst();
LAB_00124d92:
  pcStack_4b8 = (code *)0x124d97;
  allocInst();
LAB_00124d97:
  pcStack_4b8 = (code *)0x124d9c;
  allocInst();
LAB_00124d9c:
  pcStack_4b8 = (code *)0x124da1;
  allocInst();
  pBVar38 = pBVar33;
LAB_00124da1:
  pcStack_4b8 = (code *)0x124da6;
  allocInst();
LAB_00124da6:
  pcStack_4b8 = (code *)0x124dab;
  allocInst();
LAB_00124dab:
  pcStack_4b8 = (code *)0x124db0;
  allocInst();
LAB_00124db0:
  pBVar31 = pBVar30;
  pcStack_4b8 = (code *)0x124db5;
  allocInst();
LAB_00124db5:
  pcStack_4b8 = (code *)0x124dba;
  allocInst();
LAB_00124dba:
  pcStack_4b8 = (code *)0x124dbf;
  allocInst();
LAB_00124dbf:
  pcStack_4b8 = decideOnAssignment;
  allocInst();
  uVar27 = (uint)pBVar48;
  if (uVar27 == 0) {
    pcStack_4c0 = (code *)0x124e1c;
    decideOnAssignment();
LAB_00124e1c:
    pcStack_4c0 = (code *)0x124e21;
    decideOnAssignment();
  }
  else {
    if (*(uint *)(*(long *)&pBVar46->super_FuncPass + 0x148) <= extraout_EDX) goto LAB_00124e1c;
    pBVar31 = *(BaseRAPass **)
               (*(long *)(*(long *)&pBVar46->super_FuncPass + 0x140) + (ulong)extraout_EDX * 8);
    bVar26 = pBVar31->field_0x4a;
    if ((bVar26 != 0xff) && ((uVar27 >> (bVar26 & 0x1f) & 1) != 0)) {
      return (uint)bVar26;
    }
    if ((byte)pBVar43 < 4) {
      uVar35 = *(uint *)&pBVar31->field_0x3c & uVar27;
      if (uVar35 == 0) {
        uVar35 = uVar27;
      }
      uVar27 = ~*(uint *)(&(pBVar46->_formatOptions)._indentation)[((ulong)pBVar43 & 0xff) - 0x15].
                         _data & uVar35;
      if (uVar27 == 0) {
        uVar27 = uVar35;
      }
      iVar28 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> iVar28 & 1) == 0; iVar28 = iVar28 + 1) {
        }
      }
      return iVar28;
    }
  }
  uVar27 = (uint)pBVar31;
  pcStack_4c0 = decideOnReassignment;
  decideOnAssignment();
  uVar35 = (uint)pBVar48;
  if (uVar35 == 0) {
    pBStack_4c8 = (BaseRAPass *)0x124ef1;
    decideOnReassignment();
  }
  else if (extraout_EDX_00 < *(uint *)(*(long *)&pBVar46->super_FuncPass + 0x148)) {
    lVar29 = *(long *)(*(long *)(*(long *)&pBVar46->super_FuncPass + 0x140) +
                      (ulong)extraout_EDX_00 * 8);
    bVar26 = *(byte *)(lVar29 + 0x4a);
    if ((bVar26 != 0xff) && ((uVar35 >> (bVar26 & 0x1f) & 1) != 0)) {
      return (uint)bVar26;
    }
    uVar27 = extraout_EDX_00;
    if ((byte)pBVar43 < 4) {
      uVar52 = (ulong)pBVar43 & 0xff;
      iVar28 = (int)uVar52;
      uVar34 = (ulong)*(byte *)((long)(&pBVar50->_formatOptions + -10) + uVar52 + 8);
      if (uVar34 == 0) goto LAB_00124ea9;
      puVar41 = (uint *)((long)(&pBVar50->_formatOptions + -5) +
                        (ulong)((*(uint *)((long)&((Layout *)&pBVar50->super_FuncPass)->workRegs + 4
                                          ) >> ((byte)pBVar43 * '\b' & 0x1f) & 0xff) << 5));
      goto LAB_00124e97;
    }
    goto LAB_00124ef6;
  }
  pBStack_4c8 = (BaseRAPass *)0x124ef6;
  decideOnReassignment();
LAB_00124ef6:
  pBStack_4c8 = (BaseRAPass *)0x124efb;
  decideOnReassignment();
  pBStack_4e8 = pBVar38;
  pBStack_4e0 = pBVar55;
  pBStack_4d8 = pBVar57;
  pBStack_4d0 = pBVar21;
  pBStack_4c8 = pBVar40;
  if (uVar27 == 0) goto LAB_00124fda;
  if (3 < (byte)pBVar43) goto LAB_00124fdf;
  uVar35 = 0;
  if (uVar27 != 0) {
    for (; (uVar27 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
    }
  }
  uVar52 = (ulong)pBVar43 & 0xff;
  pBVar43 = *(BaseRAPass **)((long)(&pBVar46->_formatOptions + -2) + uVar52 * 8);
  aVar49 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)
           ((anon_union_4_2_ebeb14a8_for_RARegCount_0 *)
           (&((Layout *)&pBVar43->super_FuncPass)->physIndex + uVar35))->_packed;
  pBVar32 = (BaseRAPass *)(ulong)aVar49._packed;
  uVar27 = uVar27 - 1 & uVar27;
  if (uVar27 != 0) {
    RVar6.field_0 =
         (anon_union_4_2_ebeb14a8_for_RARegCount_0)
         ((anon_union_4_2_ebeb14a8_for_RARegCount_0 *)(*(long *)&pBVar46->super_FuncPass + 0x148))->
         _packed;
    if ((uint)RVar6.field_0 <= aVar49._packed) {
LAB_00124fe4:
      pBStack_4f0 = (BaseRAPass *)0x124fe9;
      decideOnSpillFor();
      pPVar39 = *(PhysToWorkMap **)&pBVar43->field_0x20;
      node = (InstNode *)(ulong)(pPVar39->dirty)._masks._data[0];
      if (node != (InstNode *)0x0) {
        pBStack_530 = (BaseRAPass *)&pBVar46->field_0x48;
        puVar41 = pPVar39[2].assigned._masks._data + 3;
        pIVar61 = (InstNode *)0x0;
        pBVar32 = pBVar46;
        pIStack_528 = node;
        pBStack_520 = pBVar43;
        pBStack_518 = pBVar38;
        pBStack_510 = pBVar55;
        pBStack_508 = pBVar42;
        pBStack_500 = pBVar57;
        pBStack_4f8 = pBVar21;
        pBStack_4f0 = pBVar40;
        do {
          if ((InstNode *)(ulong)(pPVar39->dirty)._masks._data[0] <= pIVar61) {
            puStack_548 = (uint *)0x125140;
            spillAfterAllocation();
LAB_00125140:
            puStack_548 = (uint *)0x125145;
            spillAfterAllocation();
LAB_00125145:
            puStack_548 = (uint *)0x12514a;
            spillAfterAllocation();
LAB_0012514a:
            puStack_548 = (uint *)0x12514f;
            spillAfterAllocation();
LAB_0012514f:
            puStack_548 = (uint *)0x125154;
            spillAfterAllocation();
LAB_00125154:
            puStack_548 = (uint *)0x125159;
            spillAfterAllocation();
            ((pBVar32->super_FuncPass).super_Pass._cb)->_cursor = *(BaseNode **)node;
            pPStack_570 = pPVar39;
            pBStack_568 = pBVar55;
            pBStack_560 = pBVar42;
            pBStack_558 = pBVar46;
            pIStack_550 = pIVar61;
            puStack_548 = puVar41;
            if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
              EVar20 = switchToAssignment((RALocalAllocator *)pBVar32,
                                          *(PhysToWorkMap **)(block + 200),
                                          (ZoneBitVector *)(block + 0x78),
                                          SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
              pPVar39 = (PhysToWorkMap *)(ulong)EVar20;
              if (EVar20 != 0) {
                return EVar20;
              }
            }
            EVar20 = allocInst((RALocalAllocator *)pBVar32,node);
            if (EVar20 != 0) {
              return EVar20;
            }
            uVar27 = *(uint *)(block + 0xb8);
            if ((ulong)uVar27 == 0xffffffff) {
              pRVar25 = block + 0xbc;
LAB_001251fe:
              EVar20 = spillScratchGpRegsBeforeEntry
                                 ((RALocalAllocator *)pBVar32,*(RegMask *)pRVar25);
              if (EVar20 != 0) {
                return EVar20;
              }
              pBVar21 = (BaseRAPass *)(pBVar32->super_FuncPass).super_Pass._vptr_Pass;
              if (*(long *)(block + 200) == 0) {
                EVar20 = BaseRAPass::setBlockEntryAssignment
                                   (pBVar21,block,*(RABlock **)&pBVar32->field_0xd8,
                                    (RAAssignment *)&pBVar32->field_0x48);
                if (EVar20 != 0) {
                  return EVar20;
                }
                goto LAB_001253c0;
              }
              pBVar10 = *(BaseNode **)pBVar21->_extraBlock;
              pRVar25 = (RABlock *)
                        BaseBuilder::setCursor((pBVar32->super_FuncPass).super_Pass._cb,pBVar10);
              __src = *(void **)&pBVar32->field_0x60;
              memcpy(*(void **)&pBVar32->_blocks,*(void **)&pBVar32->field_0x68,
                     (ulong)*(uint *)&pBVar32->_func * 4 + 0x20);
              memcpy(pBVar32->_extraBlock,__src,(ulong)*(uint *)((long)&pBVar32->_func + 4));
              bVar63 = false;
              EVar20 = switchToAssignment((RALocalAllocator *)pBVar32,
                                          *(PhysToWorkMap **)(block + 200),
                                          (ZoneBitVector *)(block + 0x78),
                                          SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
              if (EVar20 != 0) goto LAB_001253bb;
              pBVar11 = (pBVar32->super_FuncPass).super_Pass._cb;
              EVar20 = (Error)pPVar39;
              if (pBVar11->_cursor != pBVar10) {
                if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_001253d8;
                lVar29 = (ulong)((byte)node[0x12] - 1) * 0x10;
                if ((*(uint *)(node + lVar29 + 0x40) & 7) != 5) goto LAB_001253dd;
                (*(pBVar11->super_BaseEmitter)._vptr_BaseEmitter[4])(&uStack_598);
                uStack_588 = *(undefined8 *)(node + lVar29 + 0x40);
                uStack_580 = *(undefined8 *)(node + lVar29 + 0x48);
                *(undefined4 *)(node + lVar29 + 0x40) = uStack_598;
                *(undefined4 *)(node + lVar29 + 0x44) = uStack_594;
                *(undefined4 *)(node + lVar29 + 0x48) = uStack_590;
                *(undefined4 *)(node + lVar29 + 0x4c) = uStack_58c;
                node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
                EVar20 = (**(code **)(*(pBVar32->super_FuncPass).super_Pass._vptr_Pass + 0x68))();
                bVar63 = EVar20 == 0;
                if (bVar63) {
                  pBVar11 = (pBVar32->super_FuncPass).super_Pass._cb;
                  pBVar11->_cursor = pBVar10;
                  (*(pBVar11->super_BaseEmitter)._vptr_BaseEmitter[6])(pBVar11,&uStack_598);
                  EVar20 = (Error)pPVar39;
                }
                goto LAB_00125340;
              }
            }
            else {
              if (uVar27 < *(uint *)(*(long *)block + 0xf0)) {
                pRVar25 = (RABlock *)((ulong)uVar27 * 0x20 + *(long *)(*(long *)block + 0xe8));
                goto LAB_001251fe;
              }
              allocBranch();
              pRVar25 = block;
LAB_001253d8:
              allocBranch();
LAB_001253dd:
              EVar20 = 3;
              bVar63 = false;
LAB_00125340:
              if (!bVar63) {
                bVar63 = false;
                goto LAB_001253bb;
              }
            }
            ((pBVar32->super_FuncPass).super_Pass._cb)->_cursor = (BaseNode *)pRVar25;
            pBVar10 = *(BaseNode **)&pBVar32->field_0x60;
            uVar17 = pBVar32->field_0x68;
            uVar62 = *(undefined7 *)&pBVar32->field_0x69;
            *(BaseNode **)&pBVar32->field_0x60 = pBVar32->_extraBlock;
            pBVar32->field_0x68 = pBVar32->_blocks;
            *(undefined7 *)&pBVar32->field_0x69 = *(undefined7 *)&pBVar32->field_0xb1;
            pBVar32->_extraBlock = pBVar10;
            pBVar32->_blocks = (RABlocks)uVar17;
            *(undefined7 *)&pBVar32->field_0xb1 = uVar62;
            lVar29 = 0;
            do {
              uVar12 = *(undefined8 *)((long)(&pBVar32->_formatOptions + -2) + lVar29 * 8);
              pBVar13 = (BaseEmitHelper *)
                        ((undefined8 *)((long)(&pBVar32->_formatOptions + -2) + lVar29 * 8))[1];
              pBVar14 = *(BaseEmitHelper **)
                         ((undefined8 *)((long)(&pBVar32->_formatOptions + 4) + lVar29 * 8) + 1);
              *(undefined8 *)((long)(&pBVar32->_formatOptions + -2) + lVar29 * 8) =
                   *(undefined8 *)((long)(&pBVar32->_formatOptions + 4) + lVar29 * 8);
              ((undefined8 *)((long)(&pBVar32->_formatOptions + -2) + lVar29 * 8))[1] = pBVar14;
              *(undefined8 *)((long)(&pBVar32->_formatOptions + 4) + lVar29 * 8) = uVar12;
              *(BaseEmitHelper **)
               ((undefined8 *)((long)(&pBVar32->_formatOptions + 4) + lVar29 * 8) + 1) = pBVar13;
              lVar29 = lVar29 + 2;
            } while (lVar29 != 4);
            bVar63 = true;
LAB_001253bb:
            if (bVar63) {
LAB_001253c0:
              EVar20 = 0;
            }
            return EVar20;
          }
          bVar63 = true;
          if ((*puVar41 & 0x20000) != 0) {
            uVar27 = puVar41[-2];
            pBVar55 = (BaseRAPass *)(ulong)uVar27;
            pp_Var9 = (pBVar46->super_FuncPass).super_Pass._vptr_Pass;
            if (*(uint *)(pp_Var9 + 0x29) <= uVar27) goto LAB_00125140;
            lVar29 = *(long *)(pp_Var9[0x28] + (long)pBVar55 * 8);
            if (*(char *)(lVar29 + 0x4a) != -1) goto LAB_00125110;
            if (uVar27 == 0xffffffff) goto LAB_00125145;
            if (*(uint *)&pBVar46->field_0x54 <= uVar27) goto LAB_0012514a;
            bVar26 = (((Layout *)&pBVar55->super_FuncPass)->physIndex).super_RARegCount.field_0.
                     _regs[*(long *)&pBVar46->field_0x60];
            pBVar42 = (BaseRAPass *)(ulong)bVar26;
            if (bVar26 == 0xff) goto LAB_00125110;
            RVar18 = *(RegGroup *)(lVar29 + 0x21);
            ((pBVar46->super_FuncPass).super_Pass._cb)->_cursor = (BaseNode *)pBStack_520;
            if (0x1f < bVar26) goto LAB_0012514f;
            RVar18 = RVar18 & kMaxValue;
            if (kExtraVirt3 < RVar18) goto LAB_00125154;
            if ((*(uint *)(*(long *)&pBVar46->field_0x68 + 0x10 + (ulong)RVar18 * 4) >>
                 (bVar26 & 0x1f) & 1) == 0) {
LAB_001250e9:
              puStack_548 = (uint *)0x1250f9;
              pBVar32 = pBStack_530;
              RAAssignment::unassign((RAAssignment *)pBStack_530,RVar18,uVar27,(uint)bVar26);
              EVar20 = 0;
            }
            else {
              puStack_548 = (uint *)0x1250e0;
              pBVar32 = pBVar46;
              uStack_538 = (ulong)RVar18;
              EVar20 = onSaveReg((RALocalAllocator *)pBVar46,RVar18,uVar27,(uint)bVar26);
              RVar18 = (RegGroup)uStack_538;
              if (EVar20 == 0) goto LAB_001250e9;
            }
            bVar63 = EVar20 == 0;
            node = pIStack_528;
            if (!bVar63) {
              EStack_53c = EVar20;
            }
          }
LAB_00125110:
          if (!bVar63) {
            return EStack_53c;
          }
          pIVar61 = pIVar61 + 1;
          puVar41 = puVar41 + 8;
        } while (node != pIVar61);
      }
      return 0;
    }
    lVar29 = *(long *)(*(long *)&pBVar46->super_FuncPass + 0x140);
    uVar53 = (uint)(*(float *)(*(long *)(lVar29 + (long)pBVar32 * 8) + 100) * 1048576.0);
    uVar36 = *(uint *)(*(long *)&pBVar46->field_0x68 + 0x10 + uVar52 * 4);
    pBVar46 = (BaseRAPass *)(ulong)uVar36;
    uVar44 = uVar53 + 0x40000;
    if ((uVar36 >> (uVar35 & 0x1f) & 1) == 0) {
      uVar44 = uVar53;
    }
    pBVar30 = (BaseRAPass *)(ulong)uVar44;
    do {
      uVar44 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
        }
      }
      pBVar38 = (BaseRAPass *)(ulong)uVar44;
      aVar49 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)
               (&((Layout *)&pBVar43->super_FuncPass)->physIndex)[(long)pBVar38].super_RARegCount.
               field_0._packed;
      pBVar57 = (BaseRAPass *)(ulong)aVar49._packed;
      if ((uint)RVar6.field_0 <= aVar49._packed) {
        pBStack_4f0 = (BaseRAPass *)0x124fda;
        decideOnSpillFor();
LAB_00124fda:
        pBStack_4f0 = (BaseRAPass *)0x124fdf;
        decideOnSpillFor();
LAB_00124fdf:
        pBStack_4f0 = (BaseRAPass *)0x124fe4;
        decideOnSpillFor();
        goto LAB_00124fe4;
      }
      uVar53 = (uint)(*(float *)(*(long *)(lVar29 + (long)pBVar57 * 8) + 100) * 1048576.0);
      pBVar21 = (BaseRAPass *)(ulong)uVar53;
      pBVar55 = (BaseRAPass *)(ulong)(uVar53 + 0x40000);
      if ((uVar36 >> (uVar44 & 0x1f) & 1) == 0) {
        pBVar55 = pBVar21;
      }
      bVar63 = (uint)pBVar55 < (uint)pBVar30;
      if (bVar63) {
        pBVar32 = pBVar57;
        pBVar30 = pBVar55;
      }
      aVar49._packed = (uint32_t)pBVar32;
      if (bVar63) {
        uVar35 = uVar44;
      }
      uVar27 = uVar27 - 1 & uVar27;
      pBVar40 = (BaseRAPass *)(ulong)uVar27;
    } while (uVar27 != 0);
  }
  (((Layout *)&pBVar48->super_FuncPass)->physIndex).super_RARegCount.field_0._packed =
       (uint32_t)aVar49;
  return uVar35;
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  _tmpWorkToPhysMap = _pass->newWorkToPhysMap();

  if (!physToWorkMap || !workToPhysMap || !_tmpWorkToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}